

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_sin>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [48];
  undefined1 auVar64 [24];
  undefined1 auVar65 [24];
  undefined8 uVar66;
  undefined8 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined1 auVar81 [32];
  undefined1 auVar80 [16];
  long *in_RDI;
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  float fVar88;
  undefined1 auVar89 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_sin op;
  Mat *m;
  __m512 y2;
  __m512 z;
  __m512 poly_mask;
  __m512 swap_sign_bit;
  __m512i imm2;
  __m512i imm0;
  __m512 y;
  __m512 sign_bit;
  __m512 xmm3;
  __m512 xmm2;
  __m512 xmm1;
  __m256 y2_1;
  __m256 z_1;
  __m256 poly_mask_1;
  __m256 swap_sign_bit_1;
  __m256i imm2_1;
  __m256i imm0_1;
  __m256 y_1;
  __m256 sign_bit_1;
  __m256 xmm3_1;
  __m256 xmm2_1;
  __m256 xmm1_1;
  v4sf y2_2;
  v4sf z_2;
  v4sf poly_mask_2;
  v4sf swap_sign_bit_2;
  v4si emm2;
  v4si emm0;
  v4sf y_2;
  v4sf sign_bit_2;
  v4sf xmm3_2;
  v4sf xmm2_2;
  v4sf xmm1_2;
  undefined8 local_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  int local_297c;
  undefined8 local_2978;
  undefined8 local_2970;
  undefined8 local_2968;
  undefined4 local_2960;
  long local_2958;
  undefined4 local_2950;
  undefined4 local_294c;
  undefined4 local_2948;
  undefined4 local_2944;
  undefined4 local_2940;
  undefined8 local_2938;
  undefined1 (*local_2930) [64];
  int local_2928;
  int local_2924;
  int local_2920;
  int local_291c;
  int local_2918;
  int local_2914;
  int local_2910;
  undefined1 local_2909 [9];
  long *local_2900;
  undefined1 local_28f5;
  int local_28f4;
  undefined8 *local_28e8;
  undefined8 *local_28e0;
  undefined8 *local_28d0;
  undefined1 (*local_28c8) [64];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined1 (*local_2850) [64];
  undefined1 (*local_2848) [64];
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 (*local_2820) [64];
  undefined1 (*local_2818) [64];
  undefined8 local_2810;
  undefined8 uStack_2808;
  undefined1 (*local_2800) [64];
  long local_27f8;
  undefined4 local_27ec;
  long local_27e8;
  undefined1 (*local_27e0) [64];
  undefined4 local_27d4;
  int local_27d0;
  int local_27cc;
  undefined8 *local_27c8;
  undefined4 local_27bc;
  long local_27b8;
  undefined8 *local_27a8;
  undefined8 *local_2780;
  undefined1 *local_2778;
  undefined8 *local_2770;
  undefined1 *local_2768;
  undefined8 *local_2760;
  undefined1 *local_2758;
  undefined1 (*local_2750) [64];
  undefined1 *local_2748;
  undefined1 local_2740 [8];
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [8];
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [64];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_2500 [2];
  float afStack_24f8 [2];
  float afStack_24f0 [2];
  float afStack_24e8 [2];
  float afStack_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  float local_24c0 [2];
  float afStack_24b8 [2];
  float afStack_24b0 [2];
  float afStack_24a8 [2];
  float afStack_24a0 [2];
  float afStack_2498 [2];
  float afStack_2490 [2];
  float afStack_2488 [2];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined4 local_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  int local_2280 [2];
  int aiStack_2278 [2];
  int aiStack_2270 [2];
  int aiStack_2268 [2];
  int aiStack_2260 [2];
  int aiStack_2258 [2];
  int aiStack_2250 [2];
  int aiStack_2248 [2];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  float local_2000 [2];
  float afStack_1ff8 [2];
  float afStack_1ff0 [2];
  float afStack_1fe8 [2];
  float afStack_1fe0 [2];
  float afStack_1fd8 [2];
  float afStack_1fd0 [2];
  float afStack_1fc8 [2];
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  float local_1ec0 [2];
  float afStack_1eb8 [2];
  float afStack_1eb0 [2];
  float afStack_1ea8 [2];
  float afStack_1ea0 [2];
  float afStack_1e98 [2];
  float afStack_1e90 [2];
  float afStack_1e88 [2];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  float afStack_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  float local_1d80 [2];
  float afStack_1d78 [2];
  float afStack_1d70 [2];
  float afStack_1d68 [2];
  float afStack_1d60 [2];
  float afStack_1d58 [2];
  float afStack_1d50 [2];
  float afStack_1d48 [2];
  float local_1d40 [2];
  float afStack_1d38 [2];
  float afStack_1d30 [2];
  float afStack_1d28 [2];
  float afStack_1d20 [2];
  float afStack_1d18 [2];
  float afStack_1d10 [2];
  float afStack_1d08 [2];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80 [2];
  float afStack_1c78 [2];
  float afStack_1c70 [2];
  float afStack_1c68 [2];
  float afStack_1c60 [2];
  float afStack_1c58 [2];
  float afStack_1c50 [2];
  float afStack_1c48 [2];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  float local_1c00 [2];
  float afStack_1bf8 [2];
  float afStack_1bf0 [2];
  float afStack_1be8 [2];
  float afStack_1be0 [2];
  float afStack_1bd8 [2];
  float afStack_1bd0 [2];
  float afStack_1bc8 [2];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float local_1b80 [2];
  float afStack_1b78 [2];
  float afStack_1b70 [2];
  float afStack_1b68 [2];
  float afStack_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float afStack_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00 [2];
  float afStack_19f8 [2];
  float afStack_19f0 [2];
  float afStack_19e8 [2];
  float afStack_19e0 [2];
  float afStack_19d8 [2];
  float afStack_19d0 [2];
  float afStack_19c8 [2];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  float local_1940 [2];
  float afStack_1938 [2];
  float afStack_1930 [2];
  float afStack_1928 [2];
  float afStack_1920 [2];
  float afStack_1918 [2];
  float afStack_1910 [2];
  float afStack_1908 [2];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  float afStack_1820 [2];
  float afStack_1818 [2];
  float afStack_1810 [2];
  float afStack_1808 [2];
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined4 local_16c4;
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [64];
  undefined2 local_1582;
  undefined1 local_1580 [64];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [8];
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  ulong local_11a0;
  ulong uStack_1198;
  ulong uStack_1190;
  ulong uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [8];
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [16];
  ulong uStack_1110;
  ulong uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  ulong local_1060;
  ulong uStack_1058;
  ulong uStack_1050;
  ulong uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined4 local_1000;
  undefined4 uStack_ffc;
  undefined4 uStack_ff8;
  undefined4 uStack_ff4;
  undefined4 uStack_ff0;
  undefined4 uStack_fec;
  undefined4 uStack_fe8;
  undefined4 uStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined4 local_fc0;
  undefined4 uStack_fbc;
  undefined4 uStack_fb8;
  undefined4 uStack_fb4;
  undefined4 uStack_fb0;
  undefined4 uStack_fac;
  undefined4 uStack_fa8;
  undefined4 uStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined4 local_e60;
  undefined4 uStack_e5c;
  undefined4 uStack_e58;
  undefined4 uStack_e54;
  undefined4 uStack_e50;
  undefined4 uStack_e4c;
  undefined4 uStack_e48;
  undefined4 uStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined1 *local_e18;
  undefined1 *local_e10;
  undefined1 *local_e08;
  float *local_e00;
  float *local_df8;
  undefined1 *local_df0;
  float *local_de8;
  float *local_de0;
  undefined1 *local_dd8;
  float *local_dd0;
  float *local_dc8;
  undefined1 *local_dc0;
  float *local_db8;
  float *local_db0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  undefined8 *local_d98;
  undefined1 *local_d90;
  undefined1 *local_d88;
  undefined8 *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  undefined4 *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  float *local_d50;
  float *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined4 local_d00;
  undefined4 uStack_cfc;
  undefined4 uStack_cf8;
  undefined4 uStack_cf4;
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  undefined4 uStack_ce8;
  undefined4 uStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float local_b00 [2];
  float afStack_af8 [2];
  float afStack_af0 [2];
  float afStack_ae8 [2];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0 [2];
  float afStack_a98 [2];
  float afStack_a90 [2];
  float afStack_a88 [2];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  float local_a40 [2];
  float afStack_a38 [2];
  float afStack_a30 [2];
  float afStack_a28 [2];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0 [2];
  float afStack_9d8 [2];
  float afStack_9d0 [2];
  float afStack_9c8 [2];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  ulong local_720;
  ulong uStack_718;
  ulong uStack_710;
  ulong uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  ulong local_6e0;
  ulong uStack_6d8;
  ulong uStack_6d0;
  ulong uStack_6c8;
  ulong local_6c0;
  ulong uStack_6b8;
  ulong uStack_6b0;
  ulong uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  ulong local_630;
  ulong uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  ulong local_5f0;
  ulong uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  ulong local_590;
  ulong uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 *local_408;
  float *local_400;
  float *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  float *local_3d8;
  float *local_3d0;
  undefined1 *local_3c8;
  float *local_3c0;
  float *local_3b8;
  undefined1 *local_3b0;
  float *local_3a8;
  float *local_3a0;
  undefined1 *local_398;
  float *local_390;
  float *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined8 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined8 *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined4 *local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  ulong local_b0;
  ulong uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong local_90;
  ulong uStack_88;
  ulong local_80;
  ulong uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2910 = *(int *)((long)in_RDI + 0x2c);
  local_2914 = (int)in_RDI[6];
  local_2918 = *(int *)((long)in_RDI + 0x34);
  local_291c = (int)in_RDI[7];
  local_2920 = (int)in_RDI[3];
  local_2924 = local_2910 * local_2914 * local_2918 * local_2920;
  local_2900 = in_RDI;
  for (local_2928 = 0; local_2928 < local_291c; local_2928 = local_2928 + 1) {
    local_28e8 = &local_2978;
    local_27cc = *(int *)((long)local_2900 + 0x2c);
    local_27d0 = (int)local_2900[6];
    local_27d4 = *(undefined4 *)((long)local_2900 + 0x34);
    local_27e0 = (undefined1 (*) [64])
                 (*local_2900 + local_2900[8] * (long)local_2928 * local_2900[2]);
    local_27e8 = local_2900[2];
    local_27ec = (undefined4)local_2900[3];
    local_27f8 = local_2900[4];
    local_27c8 = &local_2978;
    local_27b8 = (long)local_27cc * (long)local_27d0 * local_27e8;
    local_28e0 = &local_2978;
    local_28d0 = &local_2978;
    local_27bc = 0x10;
    local_28f4 = local_2928;
    local_28f5 = 1;
    local_2978 = 0;
    local_2968 = 0;
    local_2960 = 0;
    local_2950 = 0;
    local_294c = 0;
    local_2948 = 0;
    local_2944 = 0;
    local_2940 = 0;
    local_2938 = 0;
    local_2970 = 0;
    local_2930 = local_27e0;
    for (local_297c = 0; uVar66 = local_1100, uVar67 = uStack_10f8, uVar10 = uStack_10f0,
        uVar11 = uStack_10e8, local_297c + 0xf < local_2924; local_297c = local_297c + 0x10) {
      local_28c8 = local_2930;
      auVar63 = *(undefined1 (*) [48])*local_2930;
      uStack_2210 = *(undefined8 *)(*local_2930 + 0x30);
      uStack_2208 = *(undefined8 *)(*local_2930 + 0x38);
      local_2778 = local_2909;
      local_2780 = &local_29c0;
      local_2480._0_8_ = auVar63._0_8_;
      local_2480._8_8_ = auVar63._8_8_;
      local_2480._16_8_ = auVar63._16_8_;
      local_2480._24_8_ = auVar63._24_8_;
      local_2480._32_8_ = auVar63._32_8_;
      local_2480._40_8_ = auVar63._40_8_;
      local_1640 = local_2480._0_8_;
      uStack_1638 = local_2480._8_8_;
      uStack_1630 = local_2480._16_8_;
      uStack_1628 = local_2480._24_8_;
      uStack_1620 = local_2480._32_8_;
      uStack_1618 = local_2480._40_8_;
      local_1540 = local_2480._0_8_;
      uStack_1538 = local_2480._8_8_;
      uStack_1530 = local_2480._16_8_;
      uStack_1528 = local_2480._24_8_;
      uStack_1520 = local_2480._32_8_;
      uStack_1518 = local_2480._40_8_;
      local_2304 = 0x7fffffff;
      auVar82 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      local_2380 = vmovdqa64_avx512f(auVar82);
      auVar82 = vmovdqa64_avx512f(local_2380);
      local_1580 = vmovdqa64_avx512f(auVar82);
      auVar82 = vmovdqa64_avx512f(*local_2930);
      auVar83 = vmovdqa64_avx512f(local_1580);
      auVar82 = vpandq_avx512f(auVar82,auVar83);
      local_23c0 = vmovdqa64_avx512f(auVar82);
      auVar82 = vmovdqa64_avx512f(local_23c0);
      auVar82 = vmovdqa64_avx512f(auVar82);
      local_2240 = local_2480._0_8_;
      uStack_2238 = local_2480._8_8_;
      uStack_2230 = local_2480._16_8_;
      uStack_2228 = local_2480._24_8_;
      uStack_2220 = local_2480._32_8_;
      uStack_2218 = local_2480._40_8_;
      local_2280[0] = -0x80000000;
      local_2280[1] = -0x80000000;
      aiStack_2278[0] = -0x80000000;
      aiStack_2278[1] = -0x80000000;
      aiStack_2270[0] = -0x80000000;
      aiStack_2270[1] = -0x80000000;
      aiStack_2268[0] = -0x80000000;
      aiStack_2268[1] = -0x80000000;
      aiStack_2260[0] = -0x80000000;
      aiStack_2260[1] = -0x80000000;
      aiStack_2258[0] = -0x80000000;
      aiStack_2258[1] = -0x80000000;
      aiStack_2250[0] = -0x80000000;
      aiStack_2250[1] = -0x80000000;
      aiStack_2248[0] = -0x80000000;
      aiStack_2248[1] = -0x80000000;
      auVar84 = vmovdqa64_avx512f(*local_2930);
      auVar83._8_4_ = -0x80000000;
      auVar83._12_4_ = -0x80000000;
      auVar83._0_4_ = -0x80000000;
      auVar83._4_4_ = -0x80000000;
      auVar83._16_4_ = -0x80000000;
      auVar83._20_4_ = -0x80000000;
      auVar83._24_4_ = -0x80000000;
      auVar83._28_4_ = -0x80000000;
      auVar83._32_4_ = -0x80000000;
      auVar83._36_4_ = -0x80000000;
      auVar83._40_4_ = -0x80000000;
      auVar83._44_4_ = -0x80000000;
      auVar83._48_4_ = -0x80000000;
      auVar83._52_4_ = -0x80000000;
      auVar83._56_4_ = -0x80000000;
      auVar83._60_4_ = -0x80000000;
      auVar83 = vmovdqa64_avx512f(auVar83);
      auVar83 = vpandd_avx512f(auVar84,auVar83);
      auVar83 = vmovdqa64_avx512f(auVar83);
      local_2480._0_8_ = auVar82._0_8_;
      local_1fc0 = local_2480._0_8_;
      local_2480._8_8_ = auVar82._8_8_;
      uStack_1fb8 = local_2480._8_8_;
      local_2480._16_8_ = auVar82._16_8_;
      uStack_1fb0 = local_2480._16_8_;
      local_2480._24_8_ = auVar82._24_8_;
      uStack_1fa8 = local_2480._24_8_;
      local_2480._32_8_ = auVar82._32_8_;
      uStack_1fa0 = local_2480._32_8_;
      local_2480._40_8_ = auVar82._40_8_;
      uStack_1f98 = local_2480._40_8_;
      local_2480._48_8_ = auVar82._48_8_;
      uStack_1f90 = local_2480._48_8_;
      local_2480._56_8_ = auVar82._56_8_;
      uStack_1f88 = local_2480._56_8_;
      local_2000[0] = 1.2732395;
      local_2000[1] = 1.2732395;
      afStack_1ff8[0] = 1.2732395;
      afStack_1ff8[1] = 1.2732395;
      afStack_1ff0[0] = 1.2732395;
      afStack_1ff0[1] = 1.2732395;
      afStack_1fe8[0] = 1.2732395;
      afStack_1fe8[1] = 1.2732395;
      afStack_1fe0[0] = 1.2732395;
      afStack_1fe0[1] = 1.2732395;
      afStack_1fd8[0] = 1.2732395;
      afStack_1fd8[1] = 1.2732395;
      afStack_1fd0[0] = 1.2732395;
      afStack_1fd0[1] = 1.2732395;
      afStack_1fc8[0] = 1.2732395;
      afStack_1fc8[1] = 1.2732395;
      auVar84._8_4_ = 1.2732395;
      auVar84._12_4_ = 1.2732395;
      auVar84._0_4_ = 1.2732395;
      auVar84._4_4_ = 1.2732395;
      auVar84._16_4_ = 1.2732395;
      auVar84._20_4_ = 1.2732395;
      auVar84._24_4_ = 1.2732395;
      auVar84._28_4_ = 1.2732395;
      auVar84._32_4_ = 1.2732395;
      auVar84._36_4_ = 1.2732395;
      auVar84._40_4_ = 1.2732395;
      auVar84._44_4_ = 1.2732395;
      auVar84._48_4_ = 1.2732395;
      auVar84._52_4_ = 1.2732395;
      auVar84._56_4_ = 1.2732395;
      auVar84._60_4_ = 1.2732395;
      auVar84 = vmulps_avx512f(auVar82,auVar84);
      local_25c0 = auVar84._0_8_;
      local_17c0 = local_25c0;
      uStack_25b8 = auVar84._8_8_;
      uStack_17b8 = uStack_25b8;
      uStack_25b0 = auVar84._16_8_;
      uStack_17b0 = uStack_25b0;
      uStack_25a8 = auVar84._24_8_;
      uStack_17a8 = uStack_25a8;
      uStack_25a0 = auVar84._32_8_;
      uStack_17a0 = uStack_25a0;
      uStack_2598 = auVar84._40_8_;
      uStack_1798 = uStack_2598;
      uStack_2590 = auVar84._48_8_;
      uStack_1790 = uStack_2590;
      uStack_2588 = auVar84._56_8_;
      uStack_1788 = uStack_2588;
      auVar84 = vcvttps2dq_avx512f(auVar84);
      local_1680 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar85 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_1);
      local_1740 = vmovdqa64_avx512f(auVar84);
      local_1780 = vmovdqa64_avx512f(auVar85);
      auVar84 = vmovdqa64_avx512f(local_1740);
      auVar85 = vmovdqa64_avx512f(local_1780);
      auVar84 = vpaddd_avx512f(auVar84,auVar85);
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar85 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_inv1);
      local_13c0 = vmovdqa64_avx512f(auVar84);
      local_1400 = vmovdqa64_avx512f(auVar85);
      auVar84 = vmovdqa64_avx512f(local_13c0);
      auVar85 = vmovdqa64_avx512f(local_1400);
      auVar84 = vpandq_avx512f(auVar84,auVar85);
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar85 = vmovdqa64_avx512f(auVar84);
      local_1600 = vmovdqa64_avx512f(auVar85);
      auVar86 = vcvtdq2ps_avx512f(local_1600);
      auVar85 = vmovdqa64_avx512f(auVar84);
      auVar87 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_4);
      local_1440 = vmovdqa64_avx512f(auVar85);
      local_1480 = vmovdqa64_avx512f(auVar87);
      auVar85 = vmovdqa64_avx512f(local_1440);
      auVar87 = vmovdqa64_avx512f(local_1480);
      auVar85 = vpandq_avx512f(auVar85,auVar87);
      auVar85 = vmovdqa64_avx512f(auVar85);
      auVar85 = vmovdqa64_avx512f(auVar85);
      local_16c0 = vmovdqa64_avx512f(auVar85);
      local_16c4 = 0x1d;
      auVar85 = vmovdqa64_avx512f(local_16c0);
      auVar85 = vpslld_avx512f(auVar85,ZEXT416(0x1d));
      local_2600 = vmovdqa64_avx512f(auVar85);
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar85 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
      local_14c0 = vmovdqa64_avx512f(auVar84);
      local_1500 = vmovdqa64_avx512f(auVar85);
      auVar84 = vmovdqa64_avx512f(local_14c0);
      auVar85 = vmovdqa64_avx512f(local_1500);
      auVar84 = vpandq_avx512f(auVar84,auVar85);
      auVar84 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(auVar84);
      uVar9 = vptestnmd_avx512f(auVar84,auVar84);
      local_1582 = (undefined2)uVar9;
      auVar84 = vpmovm2d_avx512dq(uVar9 & 0xffff);
      local_2640 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(local_2600);
      local_2400 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(local_2400);
      local_2680 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(local_2640);
      local_2440 = vmovdqa64_avx512f(auVar84);
      auVar84 = vmovdqa64_avx512f(local_2440);
      local_26c0 = vmovdqa64_avx512f(auVar84);
      local_2580._0_8_ = auVar83._0_8_;
      local_12c0 = local_2580._0_8_;
      local_2580._8_8_ = auVar83._8_8_;
      uStack_12b8 = local_2580._8_8_;
      local_2580._16_8_ = auVar83._16_8_;
      uStack_12b0 = local_2580._16_8_;
      local_2580._24_8_ = auVar83._24_8_;
      uStack_12a8 = local_2580._24_8_;
      local_2580._32_8_ = auVar83._32_8_;
      uStack_12a0 = local_2580._32_8_;
      local_2580._40_8_ = auVar83._40_8_;
      uStack_1298 = local_2580._40_8_;
      local_2580._48_8_ = auVar83._48_8_;
      uStack_1290 = local_2580._48_8_;
      local_2580._56_8_ = auVar83._56_8_;
      uStack_1288 = local_2580._56_8_;
      local_1300 = local_2680._0_8_;
      uStack_12f8 = local_2680._8_8_;
      uStack_12f0 = local_2680._16_8_;
      uStack_12e8 = local_2680._24_8_;
      uStack_12e0 = local_2680._32_8_;
      uStack_12d8 = local_2680._40_8_;
      uStack_12d0 = local_2680._48_8_;
      uStack_12c8 = local_2680._56_8_;
      auVar83 = vmovdqa64_avx512f(auVar83);
      auVar84 = vmovdqa64_avx512f(local_2680);
      auVar83 = vpxord_avx512f(auVar83,auVar84);
      local_2580 = vmovdqa64_avx512f(auVar83);
      local_24c0[0] = -0.78515625;
      local_24c0[1] = -0.78515625;
      afStack_24b8[0] = -0.78515625;
      afStack_24b8[1] = -0.78515625;
      afStack_24b0[0] = -0.78515625;
      afStack_24b0[1] = -0.78515625;
      afStack_24a8[0] = -0.78515625;
      afStack_24a8[1] = -0.78515625;
      afStack_24a0[0] = -0.78515625;
      afStack_24a0[1] = -0.78515625;
      afStack_2498[0] = -0.78515625;
      afStack_2498[1] = -0.78515625;
      afStack_2490[0] = -0.78515625;
      afStack_2490[1] = -0.78515625;
      afStack_2488[0] = -0.78515625;
      afStack_2488[1] = -0.78515625;
      local_2500[0] = -0.00024187565;
      local_2500[1] = -0.00024187565;
      afStack_24f8[0] = -0.00024187565;
      afStack_24f8[1] = -0.00024187565;
      afStack_24f0[0] = -0.00024187565;
      afStack_24f0[1] = -0.00024187565;
      afStack_24e8[0] = -0.00024187565;
      afStack_24e8[1] = -0.00024187565;
      afStack_24e0[0] = -0.00024187565;
      afStack_24e0[1] = -0.00024187565;
      afStack_24d8[0] = -0.00024187565;
      afStack_24d8[1] = -0.00024187565;
      afStack_24d0[0] = -0.00024187565;
      afStack_24d0[1] = -0.00024187565;
      afStack_24c8[0] = -0.00024187565;
      afStack_24c8[1] = -0.00024187565;
      local_25c0 = auVar86._0_8_;
      local_19c0 = local_25c0;
      uStack_25b8 = auVar86._8_8_;
      uStack_19b8 = uStack_25b8;
      uStack_25b0 = auVar86._16_8_;
      uStack_19b0 = uStack_25b0;
      uStack_25a8 = auVar86._24_8_;
      uStack_19a8 = uStack_25a8;
      uStack_25a0 = auVar86._32_8_;
      uStack_19a0 = uStack_25a0;
      uStack_2598 = auVar86._40_8_;
      uStack_1998 = uStack_2598;
      uStack_2590 = auVar86._48_8_;
      uStack_1990 = uStack_2590;
      uStack_2588 = auVar86._56_8_;
      uStack_1988 = uStack_2588;
      local_1a00[0] = -0.78515625;
      local_1a00[1] = -0.78515625;
      afStack_19f8[0] = -0.78515625;
      afStack_19f8[1] = -0.78515625;
      afStack_19f0[0] = -0.78515625;
      afStack_19f0[1] = -0.78515625;
      afStack_19e8[0] = -0.78515625;
      afStack_19e8[1] = -0.78515625;
      afStack_19e0[0] = -0.78515625;
      afStack_19e0[1] = -0.78515625;
      afStack_19d8[0] = -0.78515625;
      afStack_19d8[1] = -0.78515625;
      afStack_19d0[0] = -0.78515625;
      afStack_19d0[1] = -0.78515625;
      afStack_19c8[0] = -0.78515625;
      afStack_19c8[1] = -0.78515625;
      local_1a40 = local_2480._0_8_;
      uStack_1a38 = local_2480._8_8_;
      uStack_1a30 = local_2480._16_8_;
      uStack_1a28 = local_2480._24_8_;
      uStack_1a20 = local_2480._32_8_;
      uStack_1a18 = local_2480._40_8_;
      uStack_1a10 = local_2480._48_8_;
      uStack_1a08 = local_2480._56_8_;
      auVar30._8_4_ = -0.78515625;
      auVar30._12_4_ = -0.78515625;
      auVar30._0_4_ = -0.78515625;
      auVar30._4_4_ = -0.78515625;
      auVar30._16_4_ = -0.78515625;
      auVar30._20_4_ = -0.78515625;
      auVar30._24_4_ = -0.78515625;
      auVar30._28_4_ = -0.78515625;
      auVar30._32_4_ = -0.78515625;
      auVar30._36_4_ = -0.78515625;
      auVar30._40_4_ = -0.78515625;
      auVar30._44_4_ = -0.78515625;
      auVar30._48_4_ = -0.78515625;
      auVar30._52_4_ = -0.78515625;
      auVar30._56_4_ = -0.78515625;
      auVar30._60_4_ = -0.78515625;
      auVar82 = vfmadd213ps_avx512f(auVar30,auVar86,auVar82);
      local_1a80 = local_25c0;
      uStack_1a78 = uStack_25b8;
      uStack_1a70 = uStack_25b0;
      uStack_1a68 = uStack_25a8;
      uStack_1a60 = uStack_25a0;
      uStack_1a58 = uStack_2598;
      uStack_1a50 = uStack_2590;
      uStack_1a48 = uStack_2588;
      local_1ac0[0] = -0.00024187565;
      local_1ac0[1] = -0.00024187565;
      afStack_1ab8[0] = -0.00024187565;
      afStack_1ab8[1] = -0.00024187565;
      afStack_1ab0[0] = -0.00024187565;
      afStack_1ab0[1] = -0.00024187565;
      afStack_1aa8[0] = -0.00024187565;
      afStack_1aa8[1] = -0.00024187565;
      afStack_1aa0[0] = -0.00024187565;
      afStack_1aa0[1] = -0.00024187565;
      afStack_1a98[0] = -0.00024187565;
      afStack_1a98[1] = -0.00024187565;
      afStack_1a90[0] = -0.00024187565;
      afStack_1a90[1] = -0.00024187565;
      afStack_1a88[0] = -0.00024187565;
      afStack_1a88[1] = -0.00024187565;
      local_2480._0_8_ = auVar82._0_8_;
      local_1b00 = local_2480._0_8_;
      local_2480._8_8_ = auVar82._8_8_;
      uStack_1af8 = local_2480._8_8_;
      local_2480._16_8_ = auVar82._16_8_;
      uStack_1af0 = local_2480._16_8_;
      local_2480._24_8_ = auVar82._24_8_;
      uStack_1ae8 = local_2480._24_8_;
      local_2480._32_8_ = auVar82._32_8_;
      uStack_1ae0 = local_2480._32_8_;
      local_2480._40_8_ = auVar82._40_8_;
      uStack_1ad8 = local_2480._40_8_;
      local_2480._48_8_ = auVar82._48_8_;
      uStack_1ad0 = local_2480._48_8_;
      local_2480._56_8_ = auVar82._56_8_;
      uStack_1ac8 = local_2480._56_8_;
      auVar29._8_4_ = -0.00024187565;
      auVar29._12_4_ = -0.00024187565;
      auVar29._0_4_ = -0.00024187565;
      auVar29._4_4_ = -0.00024187565;
      auVar29._16_4_ = -0.00024187565;
      auVar29._20_4_ = -0.00024187565;
      auVar29._24_4_ = -0.00024187565;
      auVar29._28_4_ = -0.00024187565;
      auVar29._32_4_ = -0.00024187565;
      auVar29._36_4_ = -0.00024187565;
      auVar29._40_4_ = -0.00024187565;
      auVar29._44_4_ = -0.00024187565;
      auVar29._48_4_ = -0.00024187565;
      auVar29._52_4_ = -0.00024187565;
      auVar29._56_4_ = -0.00024187565;
      auVar29._60_4_ = -0.00024187565;
      auVar82 = vfmadd213ps_avx512f(auVar29,auVar86,auVar82);
      local_1b40 = local_25c0;
      uStack_1b38 = uStack_25b8;
      uStack_1b30 = uStack_25b0;
      uStack_1b28 = uStack_25a8;
      uStack_1b20 = uStack_25a0;
      uStack_1b18 = uStack_2598;
      uStack_1b10 = uStack_2590;
      uStack_1b08 = uStack_2588;
      local_1b80[0] = -3.774895e-08;
      local_1b80[1] = -3.774895e-08;
      afStack_1b78[0] = -3.774895e-08;
      afStack_1b78[1] = -3.774895e-08;
      afStack_1b70[0] = -3.774895e-08;
      afStack_1b70[1] = -3.774895e-08;
      afStack_1b68[0] = -3.774895e-08;
      afStack_1b68[1] = -3.774895e-08;
      afStack_1b60[0] = -3.774895e-08;
      afStack_1b60[1] = -3.774895e-08;
      afStack_1b58[0] = -3.774895e-08;
      afStack_1b58[1] = -3.774895e-08;
      afStack_1b50[0] = -3.774895e-08;
      afStack_1b50[1] = -3.774895e-08;
      afStack_1b48[0] = -3.774895e-08;
      afStack_1b48[1] = -3.774895e-08;
      local_2480._0_8_ = auVar82._0_8_;
      local_1bc0 = local_2480._0_8_;
      local_2480._8_8_ = auVar82._8_8_;
      uStack_1bb8 = local_2480._8_8_;
      local_2480._16_8_ = auVar82._16_8_;
      uStack_1bb0 = local_2480._16_8_;
      local_2480._24_8_ = auVar82._24_8_;
      uStack_1ba8 = local_2480._24_8_;
      local_2480._32_8_ = auVar82._32_8_;
      uStack_1ba0 = local_2480._32_8_;
      local_2480._40_8_ = auVar82._40_8_;
      uStack_1b98 = local_2480._40_8_;
      local_2480._48_8_ = auVar82._48_8_;
      uStack_1b90 = local_2480._48_8_;
      local_2480._56_8_ = auVar82._56_8_;
      uStack_1b88 = local_2480._56_8_;
      auVar28._8_4_ = -3.774895e-08;
      auVar28._12_4_ = -3.774895e-08;
      auVar28._0_4_ = -3.774895e-08;
      auVar28._4_4_ = -3.774895e-08;
      auVar28._16_4_ = -3.774895e-08;
      auVar28._20_4_ = -3.774895e-08;
      auVar28._24_4_ = -3.774895e-08;
      auVar28._28_4_ = -3.774895e-08;
      auVar28._32_4_ = -3.774895e-08;
      auVar28._36_4_ = -3.774895e-08;
      auVar28._40_4_ = -3.774895e-08;
      auVar28._44_4_ = -3.774895e-08;
      auVar28._48_4_ = -3.774895e-08;
      auVar28._52_4_ = -3.774895e-08;
      auVar28._56_4_ = -3.774895e-08;
      auVar28._60_4_ = -3.774895e-08;
      local_2480 = vfmadd213ps_avx512f(auVar28,auVar86,auVar82);
      uStack_25b8._0_4_ = 2.4433157e-05;
      uStack_25b8._4_4_ = 2.4433157e-05;
      local_25c0._0_4_ = 2.4433157e-05;
      local_25c0._4_4_ = 2.4433157e-05;
      local_2080 = local_2480._0_8_;
      uStack_2078 = local_2480._8_8_;
      uStack_2070 = local_2480._16_8_;
      uStack_2068 = local_2480._24_8_;
      uStack_2060 = local_2480._32_8_;
      uStack_2058 = local_2480._40_8_;
      uStack_2050 = local_2480._48_8_;
      uStack_2048 = local_2480._56_8_;
      local_2700 = vmulps_avx512f(local_2480,local_2480);
      local_1c00[0] = 2.4433157e-05;
      local_1c00[1] = 2.4433157e-05;
      afStack_1bf8[0] = 2.4433157e-05;
      afStack_1bf8[1] = 2.4433157e-05;
      afStack_1bf0[0] = 2.4433157e-05;
      afStack_1bf0[1] = 2.4433157e-05;
      afStack_1be8[0] = 2.4433157e-05;
      afStack_1be8[1] = 2.4433157e-05;
      afStack_1be0[0] = 2.4433157e-05;
      afStack_1be0[1] = 2.4433157e-05;
      afStack_1bd8[0] = 2.4433157e-05;
      afStack_1bd8[1] = 2.4433157e-05;
      afStack_1bd0[0] = 2.4433157e-05;
      afStack_1bd0[1] = 2.4433157e-05;
      afStack_1bc8[0] = 2.4433157e-05;
      afStack_1bc8[1] = 2.4433157e-05;
      local_1c40 = local_2700._0_8_;
      uStack_1c38 = local_2700._8_8_;
      uStack_1c30 = local_2700._16_8_;
      uStack_1c28 = local_2700._24_8_;
      uStack_1c20 = local_2700._32_8_;
      uStack_1c18 = local_2700._40_8_;
      uStack_1c10 = local_2700._48_8_;
      uStack_1c08 = local_2700._56_8_;
      local_1c80[0] = -0.0013887316;
      local_1c80[1] = -0.0013887316;
      afStack_1c78[0] = -0.0013887316;
      afStack_1c78[1] = -0.0013887316;
      afStack_1c70[0] = -0.0013887316;
      afStack_1c70[1] = -0.0013887316;
      afStack_1c68[0] = -0.0013887316;
      afStack_1c68[1] = -0.0013887316;
      afStack_1c60[0] = -0.0013887316;
      afStack_1c60[1] = -0.0013887316;
      afStack_1c58[0] = -0.0013887316;
      afStack_1c58[1] = -0.0013887316;
      afStack_1c50[0] = -0.0013887316;
      afStack_1c50[1] = -0.0013887316;
      afStack_1c48[0] = -0.0013887316;
      afStack_1c48[1] = -0.0013887316;
      auVar27._16_4_ = 2.4433157e-05;
      auVar27._20_4_ = 2.4433157e-05;
      auVar27._0_16_ = _local_25c0;
      auVar27._24_4_ = 2.4433157e-05;
      auVar27._28_4_ = 2.4433157e-05;
      auVar27._32_4_ = 2.4433157e-05;
      auVar27._36_4_ = 2.4433157e-05;
      auVar27._40_4_ = 2.4433157e-05;
      auVar27._44_4_ = 2.4433157e-05;
      auVar27._48_4_ = 2.4433157e-05;
      auVar27._52_4_ = 2.4433157e-05;
      auVar27._56_4_ = 2.4433157e-05;
      auVar27._60_4_ = 2.4433157e-05;
      auVar26._8_4_ = -0.0013887316;
      auVar26._12_4_ = -0.0013887316;
      auVar26._0_4_ = -0.0013887316;
      auVar26._4_4_ = -0.0013887316;
      auVar26._16_4_ = -0.0013887316;
      auVar26._20_4_ = -0.0013887316;
      auVar26._24_4_ = -0.0013887316;
      auVar26._28_4_ = -0.0013887316;
      auVar26._32_4_ = -0.0013887316;
      auVar26._36_4_ = -0.0013887316;
      auVar26._40_4_ = -0.0013887316;
      auVar26._44_4_ = -0.0013887316;
      auVar26._48_4_ = -0.0013887316;
      auVar26._52_4_ = -0.0013887316;
      auVar26._56_4_ = -0.0013887316;
      auVar26._60_4_ = -0.0013887316;
      auVar82 = vfmadd213ps_avx512f(local_2700,auVar27,auVar26);
      local_25c0 = auVar82._0_8_;
      local_1cc0 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_1cb8 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_1cb0 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_1ca8 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_1ca0 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_1c98 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_1c90 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_1c88 = uStack_2588;
      local_1d00 = local_2700._0_8_;
      uStack_1cf8 = local_2700._8_8_;
      uStack_1cf0 = local_2700._16_8_;
      uStack_1ce8 = local_2700._24_8_;
      uStack_1ce0 = local_2700._32_8_;
      uStack_1cd8 = local_2700._40_8_;
      uStack_1cd0 = local_2700._48_8_;
      uStack_1cc8 = local_2700._56_8_;
      local_1d40[0] = 0.041666646;
      local_1d40[1] = 0.041666646;
      afStack_1d38[0] = 0.041666646;
      afStack_1d38[1] = 0.041666646;
      afStack_1d30[0] = 0.041666646;
      afStack_1d30[1] = 0.041666646;
      afStack_1d28[0] = 0.041666646;
      afStack_1d28[1] = 0.041666646;
      afStack_1d20[0] = 0.041666646;
      afStack_1d20[1] = 0.041666646;
      afStack_1d18[0] = 0.041666646;
      afStack_1d18[1] = 0.041666646;
      afStack_1d10[0] = 0.041666646;
      afStack_1d10[1] = 0.041666646;
      afStack_1d08[0] = 0.041666646;
      afStack_1d08[1] = 0.041666646;
      auVar87._8_4_ = 0.041666646;
      auVar87._12_4_ = 0.041666646;
      auVar87._0_4_ = 0.041666646;
      auVar87._4_4_ = 0.041666646;
      auVar87._16_4_ = 0.041666646;
      auVar87._20_4_ = 0.041666646;
      auVar87._24_4_ = 0.041666646;
      auVar87._28_4_ = 0.041666646;
      auVar87._32_4_ = 0.041666646;
      auVar87._36_4_ = 0.041666646;
      auVar87._40_4_ = 0.041666646;
      auVar87._44_4_ = 0.041666646;
      auVar87._48_4_ = 0.041666646;
      auVar87._52_4_ = 0.041666646;
      auVar87._56_4_ = 0.041666646;
      auVar87._60_4_ = 0.041666646;
      auVar82 = vfmadd213ps_avx512f(local_2700,auVar82,auVar87);
      local_25c0 = auVar82._0_8_;
      local_20c0 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_20b8 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_20b0 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_20a8 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_20a0 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_2098 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_2090 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_2088 = uStack_2588;
      local_2100 = local_2700._0_8_;
      uStack_20f8 = local_2700._8_8_;
      uStack_20f0 = local_2700._16_8_;
      uStack_20e8 = local_2700._24_8_;
      uStack_20e0 = local_2700._32_8_;
      uStack_20d8 = local_2700._40_8_;
      uStack_20d0 = local_2700._48_8_;
      uStack_20c8 = local_2700._56_8_;
      auVar82 = vmulps_avx512f(auVar82,local_2700);
      local_25c0 = auVar82._0_8_;
      local_2140 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_2138 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_2130 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_2128 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_2120 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_2118 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_2110 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_2108 = uStack_2588;
      local_2180 = local_2700._0_8_;
      uStack_2178 = local_2700._8_8_;
      uStack_2170 = local_2700._16_8_;
      uStack_2168 = local_2700._24_8_;
      uStack_2160 = local_2700._32_8_;
      uStack_2158 = local_2700._40_8_;
      uStack_2150 = local_2700._48_8_;
      uStack_2148 = local_2700._56_8_;
      auVar82 = vmulps_avx512f(auVar82,local_2700);
      local_1900 = local_2700._0_8_;
      uStack_18f8 = local_2700._8_8_;
      uStack_18f0 = local_2700._16_8_;
      uStack_18e8 = local_2700._24_8_;
      uStack_18e0 = local_2700._32_8_;
      uStack_18d8 = local_2700._40_8_;
      uStack_18d0 = local_2700._48_8_;
      uStack_18c8 = local_2700._56_8_;
      local_1940[0] = 0.5;
      local_1940[1] = 0.5;
      afStack_1938[0] = 0.5;
      afStack_1938[1] = 0.5;
      afStack_1930[0] = 0.5;
      afStack_1930[1] = 0.5;
      afStack_1928[0] = 0.5;
      afStack_1928[1] = 0.5;
      afStack_1920[0] = 0.5;
      afStack_1920[1] = 0.5;
      afStack_1918[0] = 0.5;
      afStack_1918[1] = 0.5;
      afStack_1910[0] = 0.5;
      afStack_1910[1] = 0.5;
      afStack_1908[0] = 0.5;
      afStack_1908[1] = 0.5;
      local_25c0 = auVar82._0_8_;
      local_1980 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_1978 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_1970 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_1968 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_1960 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_1958 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_1950 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_1948 = uStack_2588;
      auVar31._8_4_ = 0.5;
      auVar31._12_4_ = 0.5;
      auVar31._0_4_ = 0.5;
      auVar31._4_4_ = 0.5;
      auVar31._16_4_ = 0.5;
      auVar31._20_4_ = 0.5;
      auVar31._24_4_ = 0.5;
      auVar31._28_4_ = 0.5;
      auVar31._32_4_ = 0.5;
      auVar31._36_4_ = 0.5;
      auVar31._40_4_ = 0.5;
      auVar31._44_4_ = 0.5;
      auVar31._48_4_ = 0.5;
      auVar31._52_4_ = 0.5;
      auVar31._56_4_ = 0.5;
      auVar31._60_4_ = 0.5;
      auVar82 = vfnmadd213ps_avx512f(auVar31,local_2700,auVar82);
      local_25c0 = auVar82._0_8_;
      local_1800 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_17f8 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_17f0 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_17e8 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_17e0 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_17d8 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_17d0 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_17c8 = uStack_2588;
      local_1840[0] = 1.0;
      local_1840[1] = 1.0;
      afStack_1838[0] = 1.0;
      afStack_1838[1] = 1.0;
      afStack_1830[0] = 1.0;
      afStack_1830[1] = 1.0;
      afStack_1828[0] = 1.0;
      afStack_1828[1] = 1.0;
      afStack_1820[0] = 1.0;
      afStack_1820[1] = 1.0;
      afStack_1818[0] = 1.0;
      afStack_1818[1] = 1.0;
      afStack_1810[0] = 1.0;
      afStack_1810[1] = 1.0;
      afStack_1808[0] = 1.0;
      afStack_1808[1] = 1.0;
      auVar32._8_4_ = 1.0;
      auVar32._12_4_ = 1.0;
      auVar32._0_4_ = 1.0;
      auVar32._4_4_ = 1.0;
      auVar32._16_4_ = 1.0;
      auVar32._20_4_ = 1.0;
      auVar32._24_4_ = 1.0;
      auVar32._28_4_ = 1.0;
      auVar32._32_4_ = 1.0;
      auVar32._36_4_ = 1.0;
      auVar32._40_4_ = 1.0;
      auVar32._44_4_ = 1.0;
      auVar32._48_4_ = 1.0;
      auVar32._52_4_ = 1.0;
      auVar32._56_4_ = 1.0;
      auVar32._60_4_ = 1.0;
      auVar83 = vaddps_avx512f(auVar82,auVar32);
      uStack_2738._0_4_ = -0.00019515296;
      uStack_2738._4_4_ = -0.00019515296;
      local_2740._0_4_ = -0.00019515296;
      local_2740._4_4_ = -0.00019515296;
      local_1d80[0] = -0.00019515296;
      local_1d80[1] = -0.00019515296;
      afStack_1d78[0] = -0.00019515296;
      afStack_1d78[1] = -0.00019515296;
      afStack_1d70[0] = -0.00019515296;
      afStack_1d70[1] = -0.00019515296;
      afStack_1d68[0] = -0.00019515296;
      afStack_1d68[1] = -0.00019515296;
      afStack_1d60[0] = -0.00019515296;
      afStack_1d60[1] = -0.00019515296;
      afStack_1d58[0] = -0.00019515296;
      afStack_1d58[1] = -0.00019515296;
      afStack_1d50[0] = -0.00019515296;
      afStack_1d50[1] = -0.00019515296;
      afStack_1d48[0] = -0.00019515296;
      afStack_1d48[1] = -0.00019515296;
      local_1dc0 = local_2700._0_8_;
      uStack_1db8 = local_2700._8_8_;
      uStack_1db0 = local_2700._16_8_;
      uStack_1da8 = local_2700._24_8_;
      uStack_1da0 = local_2700._32_8_;
      uStack_1d98 = local_2700._40_8_;
      uStack_1d90 = local_2700._48_8_;
      uStack_1d88 = local_2700._56_8_;
      local_1e00[0] = 0.008332161;
      local_1e00[1] = 0.008332161;
      afStack_1df8[0] = 0.008332161;
      afStack_1df8[1] = 0.008332161;
      afStack_1df0[0] = 0.008332161;
      afStack_1df0[1] = 0.008332161;
      afStack_1de8[0] = 0.008332161;
      afStack_1de8[1] = 0.008332161;
      afStack_1de0[0] = 0.008332161;
      afStack_1de0[1] = 0.008332161;
      afStack_1dd8[0] = 0.008332161;
      afStack_1dd8[1] = 0.008332161;
      afStack_1dd0[0] = 0.008332161;
      afStack_1dd0[1] = 0.008332161;
      afStack_1dc8[0] = 0.008332161;
      afStack_1dc8[1] = 0.008332161;
      auVar86._16_4_ = -0.00019515296;
      auVar86._20_4_ = -0.00019515296;
      auVar86._0_16_ = _local_2740;
      auVar86._24_4_ = -0.00019515296;
      auVar86._28_4_ = -0.00019515296;
      auVar86._32_4_ = -0.00019515296;
      auVar86._36_4_ = -0.00019515296;
      auVar86._40_4_ = -0.00019515296;
      auVar86._44_4_ = -0.00019515296;
      auVar86._48_4_ = -0.00019515296;
      auVar86._52_4_ = -0.00019515296;
      auVar86._56_4_ = -0.00019515296;
      auVar86._60_4_ = -0.00019515296;
      auVar85._8_4_ = 0.008332161;
      auVar85._12_4_ = 0.008332161;
      auVar85._0_4_ = 0.008332161;
      auVar85._4_4_ = 0.008332161;
      auVar85._16_4_ = 0.008332161;
      auVar85._20_4_ = 0.008332161;
      auVar85._24_4_ = 0.008332161;
      auVar85._28_4_ = 0.008332161;
      auVar85._32_4_ = 0.008332161;
      auVar85._36_4_ = 0.008332161;
      auVar85._40_4_ = 0.008332161;
      auVar85._44_4_ = 0.008332161;
      auVar85._48_4_ = 0.008332161;
      auVar85._52_4_ = 0.008332161;
      auVar85._56_4_ = 0.008332161;
      auVar85._60_4_ = 0.008332161;
      auVar84 = vfmadd213ps_avx512f(local_2700,auVar86,auVar85);
      local_2740 = auVar84._0_8_;
      local_1e40 = local_2740;
      uStack_2738 = auVar84._8_8_;
      uStack_1e38 = uStack_2738;
      uStack_2730 = auVar84._16_8_;
      uStack_1e30 = uStack_2730;
      uStack_2728 = auVar84._24_8_;
      uStack_1e28 = uStack_2728;
      uStack_2720 = auVar84._32_8_;
      uStack_1e20 = uStack_2720;
      uStack_2718 = auVar84._40_8_;
      uStack_1e18 = uStack_2718;
      uStack_2710 = auVar84._48_8_;
      uStack_1e10 = uStack_2710;
      uStack_2708 = auVar84._56_8_;
      uStack_1e08 = uStack_2708;
      local_1e80 = local_2700._0_8_;
      uStack_1e78 = local_2700._8_8_;
      uStack_1e70 = local_2700._16_8_;
      uStack_1e68 = local_2700._24_8_;
      uStack_1e60 = local_2700._32_8_;
      uStack_1e58 = local_2700._40_8_;
      uStack_1e50 = local_2700._48_8_;
      uStack_1e48 = local_2700._56_8_;
      local_1ec0[0] = -0.16666655;
      local_1ec0[1] = -0.16666655;
      afStack_1eb8[0] = -0.16666655;
      afStack_1eb8[1] = -0.16666655;
      afStack_1eb0[0] = -0.16666655;
      afStack_1eb0[1] = -0.16666655;
      afStack_1ea8[0] = -0.16666655;
      afStack_1ea8[1] = -0.16666655;
      afStack_1ea0[0] = -0.16666655;
      afStack_1ea0[1] = -0.16666655;
      afStack_1e98[0] = -0.16666655;
      afStack_1e98[1] = -0.16666655;
      afStack_1e90[0] = -0.16666655;
      afStack_1e90[1] = -0.16666655;
      afStack_1e88[0] = -0.16666655;
      afStack_1e88[1] = -0.16666655;
      auVar82._8_4_ = -0.16666655;
      auVar82._12_4_ = -0.16666655;
      auVar82._0_4_ = -0.16666655;
      auVar82._4_4_ = -0.16666655;
      auVar82._16_4_ = -0.16666655;
      auVar82._20_4_ = -0.16666655;
      auVar82._24_4_ = -0.16666655;
      auVar82._28_4_ = -0.16666655;
      auVar82._32_4_ = -0.16666655;
      auVar82._36_4_ = -0.16666655;
      auVar82._40_4_ = -0.16666655;
      auVar82._44_4_ = -0.16666655;
      auVar82._48_4_ = -0.16666655;
      auVar82._52_4_ = -0.16666655;
      auVar82._56_4_ = -0.16666655;
      auVar82._60_4_ = -0.16666655;
      auVar82 = vfmadd213ps_avx512f(local_2700,auVar84,auVar82);
      local_2740 = auVar82._0_8_;
      local_21c0 = local_2740;
      uStack_2738 = auVar82._8_8_;
      uStack_21b8 = uStack_2738;
      uStack_2730 = auVar82._16_8_;
      uStack_21b0 = uStack_2730;
      uStack_2728 = auVar82._24_8_;
      uStack_21a8 = uStack_2728;
      uStack_2720 = auVar82._32_8_;
      uStack_21a0 = uStack_2720;
      uStack_2718 = auVar82._40_8_;
      uStack_2198 = uStack_2718;
      uStack_2710 = auVar82._48_8_;
      uStack_2190 = uStack_2710;
      uStack_2708 = auVar82._56_8_;
      uStack_2188 = uStack_2708;
      local_2200 = local_2700._0_8_;
      uStack_21f8 = local_2700._8_8_;
      uStack_21f0 = local_2700._16_8_;
      uStack_21e8 = local_2700._24_8_;
      uStack_21e0 = local_2700._32_8_;
      uStack_21d8 = local_2700._40_8_;
      uStack_21d0 = local_2700._48_8_;
      uStack_21c8 = local_2700._56_8_;
      auVar82 = vmulps_avx512f(auVar82,local_2700);
      local_2740 = auVar82._0_8_;
      local_1f00 = local_2740;
      uStack_2738 = auVar82._8_8_;
      uStack_1ef8 = uStack_2738;
      uStack_2730 = auVar82._16_8_;
      uStack_1ef0 = uStack_2730;
      uStack_2728 = auVar82._24_8_;
      uStack_1ee8 = uStack_2728;
      uStack_2720 = auVar82._32_8_;
      uStack_1ee0 = uStack_2720;
      uStack_2718 = auVar82._40_8_;
      uStack_1ed8 = uStack_2718;
      uStack_2710 = auVar82._48_8_;
      uStack_1ed0 = uStack_2710;
      uStack_2708 = auVar82._56_8_;
      uStack_1ec8 = uStack_2708;
      local_1f80 = local_2480._0_8_;
      uStack_1f78 = local_2480._8_8_;
      uStack_1f70 = local_2480._16_8_;
      uStack_1f68 = local_2480._24_8_;
      uStack_1f60 = local_2480._32_8_;
      uStack_1f58 = local_2480._40_8_;
      uStack_1f50 = local_2480._48_8_;
      uStack_1f48 = local_2480._56_8_;
      auVar82 = vfmadd213ps_avx512f(local_2480,auVar82,local_2480);
      local_2540 = local_26c0._0_8_;
      uStack_2538 = local_26c0._8_8_;
      uStack_2530 = local_26c0._16_8_;
      uStack_2528 = local_26c0._24_8_;
      uStack_2520 = local_26c0._32_8_;
      uStack_2518 = local_26c0._40_8_;
      uStack_2510 = local_26c0._48_8_;
      uStack_2508 = local_26c0._56_8_;
      local_22c0 = local_26c0._0_8_;
      uStack_22b8 = local_26c0._8_8_;
      uStack_22b0 = local_26c0._16_8_;
      uStack_22a8 = local_26c0._24_8_;
      uStack_22a0 = local_26c0._32_8_;
      uStack_2298 = local_26c0._40_8_;
      uStack_2290 = local_26c0._48_8_;
      uStack_2288 = local_26c0._56_8_;
      local_2740 = auVar82._0_8_;
      local_2300 = local_2740;
      uStack_2738 = auVar82._8_8_;
      uStack_22f8 = uStack_2738;
      uStack_2730 = auVar82._16_8_;
      uStack_22f0 = uStack_2730;
      uStack_2728 = auVar82._24_8_;
      uStack_22e8 = uStack_2728;
      uStack_2720 = auVar82._32_8_;
      uStack_22e0 = uStack_2720;
      uStack_2718 = auVar82._40_8_;
      uStack_22d8 = uStack_2718;
      uStack_2710 = auVar82._48_8_;
      uStack_22d0 = uStack_2710;
      uStack_2708 = auVar82._56_8_;
      uStack_22c8 = uStack_2708;
      auVar84 = vmovdqa64_avx512f(local_26c0);
      auVar82 = vmovdqa64_avx512f(auVar82);
      auVar82 = vpandd_avx512f(auVar84,auVar82);
      _local_2740 = vmovdqa64_avx512f(auVar82);
      local_1240 = local_26c0._0_8_;
      uStack_1238 = local_26c0._8_8_;
      uStack_1230 = local_26c0._16_8_;
      uStack_1228 = local_26c0._24_8_;
      uStack_1220 = local_26c0._32_8_;
      uStack_1218 = local_26c0._40_8_;
      uStack_1210 = local_26c0._48_8_;
      uStack_1208 = local_26c0._56_8_;
      local_25c0 = auVar83._0_8_;
      local_1280 = local_25c0;
      uStack_25b8 = auVar83._8_8_;
      uStack_1278 = uStack_25b8;
      uStack_25b0 = auVar83._16_8_;
      uStack_1270 = uStack_25b0;
      uStack_25a8 = auVar83._24_8_;
      uStack_1268 = uStack_25a8;
      uStack_25a0 = auVar83._32_8_;
      uStack_1260 = uStack_25a0;
      uStack_2598 = auVar83._40_8_;
      uStack_1258 = uStack_2598;
      uStack_2590 = auVar83._48_8_;
      uStack_1250 = uStack_2590;
      uStack_2588 = auVar83._56_8_;
      uStack_1248 = uStack_2588;
      auVar82 = vmovdqa64_avx512f(local_26c0);
      auVar82 = vpternlogq_avx512f(auVar82,auVar82,auVar82,0xf);
      auVar82 = vpandd_avx512f(auVar82,auVar83);
      local_25c0 = auVar82._0_8_;
      local_1880 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_1878 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_1870 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_1868 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_1860 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_1858 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_1850 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_1848 = uStack_2588;
      local_18c0 = local_2740;
      uStack_18b8 = uStack_2738;
      uStack_18b0 = uStack_2730;
      uStack_18a8 = uStack_2728;
      uStack_18a0 = uStack_2720;
      uStack_1898 = uStack_2718;
      uStack_1890 = uStack_2710;
      uStack_1888 = uStack_2708;
      auVar82 = vaddps_avx512f(auVar82,_local_2740);
      local_25c0 = auVar82._0_8_;
      local_1340 = local_25c0;
      uStack_25b8 = auVar82._8_8_;
      uStack_1338 = uStack_25b8;
      uStack_25b0 = auVar82._16_8_;
      uStack_1330 = uStack_25b0;
      uStack_25a8 = auVar82._24_8_;
      uStack_1328 = uStack_25a8;
      uStack_25a0 = auVar82._32_8_;
      uStack_1320 = uStack_25a0;
      uStack_2598 = auVar82._40_8_;
      uStack_1318 = uStack_2598;
      uStack_2590 = auVar82._48_8_;
      uStack_1310 = uStack_2590;
      uStack_2588 = auVar82._56_8_;
      uStack_1308 = uStack_2588;
      local_1380 = local_2580._0_8_;
      uStack_1378 = local_2580._8_8_;
      uStack_1370 = local_2580._16_8_;
      uStack_1368 = local_2580._24_8_;
      uStack_1360 = local_2580._32_8_;
      uStack_1358 = local_2580._40_8_;
      uStack_1350 = local_2580._48_8_;
      uStack_1348 = local_2580._56_8_;
      _local_25c0 = vpxord_avx512f(auVar82,local_2580);
      local_29c0 = local_25c0;
      uStack_29b8 = uStack_25b8;
      uStack_29b0 = uStack_25b0;
      uStack_29a8 = uStack_25a8;
      uStack_29a0 = uStack_25a0;
      uStack_2998 = uStack_2598;
      uStack_2990 = uStack_2590;
      uStack_2988 = uStack_2588;
      local_2850 = local_2930;
      local_28c0 = local_25c0;
      uStack_28b8 = uStack_25b8;
      uStack_28b0 = uStack_25b0;
      uStack_28a8 = uStack_25a8;
      uStack_28a0 = uStack_25a0;
      uStack_2898 = uStack_2598;
      uStack_2890 = uStack_2590;
      uStack_2888 = uStack_2588;
      *local_2930 = _local_25c0;
      local_2930 = local_2930 + 1;
      local_2040 = local_2080;
      uStack_2038 = uStack_2078;
      uStack_2030 = uStack_2070;
      uStack_2028 = uStack_2068;
      uStack_2020 = uStack_2060;
      uStack_2018 = uStack_2058;
      uStack_2010 = uStack_2050;
      uStack_2008 = uStack_2048;
      local_1f40 = local_1f80;
      uStack_1f38 = uStack_1f78;
      uStack_1f30 = uStack_1f70;
      uStack_1f28 = uStack_1f68;
      uStack_1f20 = uStack_1f60;
      uStack_1f18 = uStack_1f58;
      uStack_1f10 = uStack_1f50;
      uStack_1f08 = uStack_1f48;
      uStack_1610 = uStack_2210;
      uStack_1608 = uStack_2208;
      uStack_1510 = uStack_2210;
      uStack_1508 = uStack_2208;
    }
    for (; uStack_10e8 = uVar11, uStack_10f0 = uVar10, uStack_10f8 = uVar67, local_1100 = uVar66,
        uVar71 = uStack_10e8._4_4_, uVar70 = uStack_10f0._4_4_, uVar69 = uStack_10f8._4_4_,
        uVar68 = local_1100._4_4_, uVar66 = local_5e0, uVar67 = uStack_5d8,
        local_297c + 7 < local_2924; local_297c = local_297c + 8) {
      local_2848 = local_2930;
      uStack_fd0 = *(undefined8 *)(*local_2930 + 0x10);
      uStack_fc8 = *(undefined8 *)(*local_2930 + 0x18);
      local_2768 = local_2909;
      local_2770 = &local_29e0;
      local_f80 = 0;
      uStack_f78 = 0;
      uStack_f70 = 0;
      uStack_f68 = 0;
      local_10a0._0_8_ = SUB168(*(undefined1 (*) [16])*local_2930,0);
      local_10a0._8_8_ = SUB168(*(undefined1 (*) [16])*local_2930,8);
      local_fa0 = local_10a0._0_8_;
      uStack_f98 = local_10a0._8_8_;
      local_fc0 = 0x7fffffff;
      uStack_fbc = 0x7fffffff;
      uStack_fb8 = 0x7fffffff;
      uStack_fb4 = 0x7fffffff;
      uStack_fb0 = 0x7fffffff;
      uStack_fac = 0x7fffffff;
      uStack_fa8 = 0x7fffffff;
      uStack_fa4 = 0x7fffffff;
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar5._16_4_ = 0x7fffffff;
      auVar5._20_4_ = 0x7fffffff;
      auVar5._24_4_ = 0x7fffffff;
      auVar5._28_4_ = 0x7fffffff;
      auVar5 = vpand_avx2(*(undefined1 (*) [32])*local_2930,auVar5);
      local_fe0 = local_10a0._0_8_;
      uStack_fd8 = local_10a0._8_8_;
      local_1000 = 0x80000000;
      uStack_ffc = 0x80000000;
      uStack_ff8 = 0x80000000;
      uStack_ff4 = 0x80000000;
      uStack_ff0 = 0x80000000;
      uStack_fec = 0x80000000;
      uStack_fe8 = 0x80000000;
      uStack_fe4 = 0x80000000;
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar81._16_4_ = 0x80000000;
      auVar81._20_4_ = 0x80000000;
      auVar81._24_4_ = 0x80000000;
      auVar81._28_4_ = 0x80000000;
      auVar6 = vpand_avx2(*(undefined1 (*) [32])*local_2930,auVar81);
      local_10a0._0_8_ = auVar5._0_8_;
      uVar12 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar5._8_8_;
      uVar13 = local_10a0._8_8_;
      local_10a0._16_8_ = auVar5._16_8_;
      uVar14 = local_10a0._16_8_;
      local_10a0._24_8_ = auVar5._24_8_;
      uVar15 = local_10a0._24_8_;
      local_e60 = 0x3fa2f983;
      uStack_e5c = 0x3fa2f983;
      uStack_e58 = 0x3fa2f983;
      uStack_e54 = 0x3fa2f983;
      uStack_e50 = 0x3fa2f983;
      uStack_e4c = 0x3fa2f983;
      uStack_e48 = 0x3fa2f983;
      uStack_e44 = 0x3fa2f983;
      local_e40._0_4_ = auVar5._0_4_;
      local_e40._4_4_ = auVar5._4_4_;
      uStack_e38._0_4_ = auVar5._8_4_;
      uStack_e38._4_4_ = auVar5._12_4_;
      uStack_e30._0_4_ = auVar5._16_4_;
      uStack_e30._4_4_ = auVar5._20_4_;
      uStack_e28._0_4_ = auVar5._24_4_;
      uStack_e28._4_4_ = auVar5._28_4_;
      local_1140._4_4_ = local_e40._4_4_ * 1.2732395;
      local_1140._0_4_ = (float)local_e40 * 1.2732395;
      uStack_1138._0_4_ = (float)uStack_e38 * 1.2732395;
      uStack_1138._4_4_ = uStack_e38._4_4_ * 1.2732395;
      uStack_1130._0_4_ = (float)uStack_e30 * 1.2732395;
      uStack_1130._4_4_ = uStack_e30._4_4_ * 1.2732395;
      auVar64 = _local_1140;
      uStack_1128._0_4_ = (float)uStack_e28 * 1.2732395;
      uStack_1128._4_4_ = uStack_e28._4_4_;
      auVar81 = _local_1140;
      local_cc0 = local_1140;
      uStack_cb8 = uStack_1138;
      uStack_1130 = auVar64._16_8_;
      uStack_cb0 = uStack_1130;
      uStack_1128 = auVar81._24_8_;
      uStack_ca8 = uStack_1128;
      local_1180._4_4_ = (int)(local_e40._4_4_ * 1.2732395);
      local_1180._0_4_ = (int)((float)local_e40 * 1.2732395);
      local_1180._8_4_ = (int)((float)uStack_e38 * 1.2732395);
      local_1180._12_4_ = (int)(uStack_e38._4_4_ * 1.2732395);
      local_1180._16_4_ = (int)((float)uStack_e30 * 1.2732395);
      local_1180._20_4_ = (int)(uStack_e30._4_4_ * 1.2732395);
      auVar64 = local_1180._0_24_;
      local_1180._24_4_ = (int)((float)uStack_e28 * 1.2732395);
      local_1180._28_4_ = (int)uStack_e28._4_4_;
      auVar81 = local_1180;
      local_c80 = local_1180._0_8_;
      uStack_c78 = local_1180._8_8_;
      local_1180._16_8_ = auVar64._16_8_;
      uStack_c70 = local_1180._16_8_;
      local_1180._24_8_ = auVar81._24_8_;
      uStack_c68 = local_1180._24_8_;
      local_ca0 = 0x100000001;
      uStack_c98 = 0x100000001;
      uStack_c90 = 0x100000001;
      uStack_c88 = 0x100000001;
      local_8a0 = local_1180._0_8_;
      uStack_898 = local_1180._8_8_;
      uStack_890 = local_1180._16_8_;
      uStack_888 = local_1180._24_8_;
      local_8c0 = 0x100000001;
      uStack_8b8 = 0x100000001;
      uStack_8b0 = 0x100000001;
      uStack_8a8 = 0x100000001;
      auVar35._16_8_ = local_1180._16_8_;
      auVar35._0_16_ = local_1180._0_16_;
      auVar35._24_8_ = local_1180._24_8_;
      auVar89._8_8_ = 0x100000001;
      auVar89._0_8_ = 0x100000001;
      auVar89._16_8_ = 0x100000001;
      auVar89._24_8_ = 0x100000001;
      auVar81 = vpaddd_avx2(auVar35,auVar89);
      local_1180._0_8_ = auVar81._0_8_;
      local_780 = local_1180._0_8_;
      local_1180._8_8_ = auVar81._8_8_;
      uStack_778 = local_1180._8_8_;
      local_1180._16_8_ = auVar81._16_8_;
      uStack_770 = local_1180._16_8_;
      local_1180._24_8_ = auVar81._24_8_;
      uStack_768 = local_1180._24_8_;
      local_7a0 = 0xfffffffefffffffe;
      uStack_798 = 0xfffffffefffffffe;
      uStack_790 = 0xfffffffefffffffe;
      uStack_788 = 0xfffffffefffffffe;
      auVar38._8_8_ = 0xfffffffefffffffe;
      auVar38._0_8_ = 0xfffffffefffffffe;
      auVar38._16_8_ = 0xfffffffefffffffe;
      auVar38._24_8_ = 0xfffffffefffffffe;
      auVar7 = vpand_avx2(auVar81,auVar38);
      local_1180._0_8_ = auVar7._0_8_;
      local_840 = local_1180._0_8_;
      local_1180._8_8_ = auVar7._8_8_;
      uStack_838 = local_1180._8_8_;
      local_1180._16_8_ = auVar7._16_8_;
      uStack_830 = local_1180._16_8_;
      local_1180._24_8_ = auVar7._24_8_;
      uStack_828 = local_1180._24_8_;
      auVar81 = vcvtdq2ps_avx(auVar7);
      local_7c0 = local_1180._0_8_;
      uStack_7b8 = local_1180._8_8_;
      uStack_7b0 = local_1180._16_8_;
      uStack_7a8 = local_1180._24_8_;
      local_7e0 = 0x400000004;
      uStack_7d8 = 0x400000004;
      uStack_7d0 = 0x400000004;
      uStack_7c8 = 0x400000004;
      auVar37._8_8_ = 0x400000004;
      auVar37._0_8_ = 0x400000004;
      auVar37._16_8_ = 0x400000004;
      auVar37._24_8_ = 0x400000004;
      auVar8 = vpand_avx2(auVar7,auVar37);
      local_1160._0_8_ = auVar8._0_8_;
      local_c40 = local_1160._0_8_;
      local_1160._8_8_ = auVar8._8_8_;
      uStack_c38 = local_1160._8_8_;
      local_1160._16_8_ = auVar8._16_8_;
      uStack_c30 = local_1160._16_8_;
      local_1160._24_8_ = auVar8._24_8_;
      uStack_c28 = local_1160._24_8_;
      local_c44 = 0x1d;
      local_860 = local_1160._0_8_;
      uStack_858 = local_1160._8_8_;
      uStack_850 = local_1160._16_8_;
      uStack_848 = local_1160._24_8_;
      local_864 = 0x1d;
      local_1160 = vpslld_avx2(auVar8,ZEXT416(0x1d));
      local_800 = local_1180._0_8_;
      uStack_7f8 = local_1180._8_8_;
      uStack_7f0 = local_1180._16_8_;
      uStack_7e8 = local_1180._24_8_;
      local_820 = 0x200000002;
      uStack_818 = 0x200000002;
      uStack_810 = 0x200000002;
      uStack_808 = 0x200000002;
      auVar36._8_8_ = 0x200000002;
      auVar36._0_8_ = 0x200000002;
      auVar36._16_8_ = 0x200000002;
      auVar36._24_8_ = 0x200000002;
      auVar7 = vpand_avx2(auVar7,auVar36);
      local_1180._0_8_ = auVar7._0_8_;
      local_740 = local_1180._0_8_;
      local_1180._8_8_ = auVar7._8_8_;
      uStack_738 = local_1180._8_8_;
      local_1180._16_8_ = auVar7._16_8_;
      uStack_730 = local_1180._16_8_;
      local_1180._24_8_ = auVar7._24_8_;
      uStack_728 = local_1180._24_8_;
      local_760 = 0;
      uStack_758 = 0;
      uStack_750 = 0;
      uStack_748 = 0;
      local_1180 = vpcmpeqd_avx2(auVar7,ZEXT1632(ZEXT816(0)));
      local_1060 = local_1160._0_8_;
      uStack_1058 = local_1160._8_8_;
      uStack_1050 = local_1160._16_8_;
      uStack_1048 = local_1160._24_8_;
      local_11a0 = local_1160._0_8_;
      uStack_1198 = local_1160._8_8_;
      uStack_1190 = local_1160._16_8_;
      uStack_1188 = local_1160._24_8_;
      local_1080 = local_1180._0_8_;
      uStack_1078 = local_1180._8_8_;
      uStack_1070 = local_1180._16_8_;
      uStack_1068 = local_1180._24_8_;
      local_11c0 = local_1180._0_8_;
      uStack_11b8 = local_1180._8_8_;
      uStack_11b0 = local_1180._16_8_;
      uStack_11a8 = local_1180._24_8_;
      local_1120._0_8_ = auVar6._0_8_;
      local_6c0 = local_1120._0_8_;
      local_1120._8_8_ = auVar6._8_8_;
      uStack_6b8 = local_1120._8_8_;
      uStack_1110 = auVar6._16_8_;
      uStack_6b0 = uStack_1110;
      uStack_1108 = auVar6._24_8_;
      uStack_6a8 = uStack_1108;
      local_6e0 = local_1160._0_8_;
      uStack_6d8 = local_1160._8_8_;
      uStack_6d0 = local_1160._16_8_;
      uStack_6c8 = local_1160._24_8_;
      local_720 = local_1120._0_8_ ^ local_1160._0_8_;
      uStack_718 = local_1120._8_8_ ^ local_1160._8_8_;
      uStack_710 = uStack_1110 ^ local_1160._16_8_;
      uStack_708 = uStack_1108 ^ local_1160._24_8_;
      local_1120._8_8_ = uStack_718;
      local_1120._0_8_ = local_720;
      uStack_1110 = uStack_710;
      uStack_1108 = uStack_708;
      local_10c0 = 0xbf490000;
      uStack_10bc = 0xbf490000;
      uStack_10b8 = 0xbf490000;
      uStack_10b4 = 0xbf490000;
      uStack_10b0 = 0xbf490000;
      uStack_10ac = 0xbf490000;
      uStack_10a8 = 0xbf490000;
      uStack_10a4 = 0xbf490000;
      local_10e0 = 0xb97da000b97da000;
      local_10e0._4_4_ = 0xb97da000;
      uStack_10d8 = 0xb97da000b97da000;
      uStack_10d8._4_4_ = 0xb97da000;
      uStack_10d0 = 0xb97da000b97da000;
      uStack_10d0._4_4_ = 0xb97da000;
      uStack_10c8 = 0xb97da000b97da000;
      uStack_10c8._4_4_ = 0xb97da000;
      local_dc0 = local_1140;
      local_d68 = &local_10c0;
      local_e18 = local_10a0;
      local_1140 = auVar81._0_8_;
      local_be0 = local_1140;
      uStack_1138 = auVar81._8_8_;
      uStack_bd8 = uStack_1138;
      uStack_1130 = auVar81._16_8_;
      uStack_bd0 = uStack_1130;
      uStack_1128 = auVar81._24_8_;
      uStack_bc8 = uStack_1128;
      local_c00 = 0xbf490000bf490000;
      uStack_bf8 = 0xbf490000bf490000;
      uStack_bf0 = 0xbf490000bf490000;
      uStack_be8 = 0xbf490000bf490000;
      auVar54._8_4_ = 0xbf490000;
      auVar54._0_8_ = 0xbf490000bf490000;
      auVar54._12_4_ = 0xbf490000;
      auVar54._16_4_ = 0xbf490000;
      auVar54._20_4_ = 0xbf490000;
      auVar54._24_4_ = 0xbf490000;
      auVar54._28_4_ = 0xbf490000;
      local_c20 = local_10a0._0_8_;
      uStack_c18 = local_10a0._8_8_;
      uStack_c10 = local_10a0._16_8_;
      uStack_c08 = local_10a0._24_8_;
      auVar80 = vfmadd213ps_fma(auVar54,auVar81,auVar5);
      local_d80 = &local_10e0;
      local_b80 = local_1140;
      uStack_b78 = uStack_1138;
      uStack_b70 = uStack_1130;
      uStack_b68 = uStack_1128;
      local_ba0 = 0xb97da000b97da000;
      uStack_b98 = 0xb97da000b97da000;
      uStack_b90 = 0xb97da000b97da000;
      uStack_b88 = 0xb97da000b97da000;
      auVar53._8_4_ = 0xb97da000;
      auVar53._0_8_ = 0xb97da000b97da000;
      auVar53._12_4_ = 0xb97da000;
      auVar53._16_4_ = 0xb97da000;
      auVar53._20_4_ = 0xb97da000;
      auVar53._24_4_ = 0xb97da000;
      auVar53._28_4_ = 0xb97da000;
      local_10a0._0_8_ = auVar80._0_8_;
      local_bc0 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar80._8_8_;
      uStack_bb8 = local_10a0._8_8_;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      auVar80 = vfmadd213ps_fma(auVar53,auVar81,ZEXT1632(auVar80));
      local_d98 = &local_1100;
      local_b20 = local_1140;
      uStack_b18 = uStack_1138;
      uStack_b10 = uStack_1130;
      uStack_b08 = uStack_1128;
      local_b40 = 0xb3222169b3222169;
      uStack_b38 = 0xb3222169b3222169;
      uStack_b30 = 0xb3222169b3222169;
      uStack_b28 = 0xb3222169b3222169;
      auVar52._8_4_ = 0xb3222169;
      auVar52._0_8_ = 0xb3222169b3222169;
      auVar52._12_4_ = 0xb3222169;
      auVar52._16_4_ = 0xb3222169;
      auVar52._20_4_ = 0xb3222169;
      auVar52._24_4_ = 0xb3222169;
      auVar52._28_4_ = 0xb3222169;
      local_10a0._0_8_ = auVar80._0_8_;
      local_b60 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar80._8_8_;
      uStack_b58 = local_10a0._8_8_;
      uStack_b50 = 0;
      uStack_b48 = 0;
      auVar80 = vfmadd213ps_fma(auVar52,auVar81,ZEXT1632(auVar80));
      auVar89 = ZEXT1632(auVar80);
      uStack_1138._0_4_ = 0x37ccf5ce;
      local_1140 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_1138._4_4_ = 0x37ccf5ce;
      uStack_1130._0_4_ = 0x37ccf5ce;
      uStack_1130._4_4_ = 0x37ccf5ce;
      auVar64 = _local_1140;
      uStack_1128._0_4_ = 0x37ccf5ce;
      uStack_1128._4_4_ = 0x37ccf5ce;
      auVar81 = _local_1140;
      local_10a0._0_8_ = auVar80._0_8_;
      local_ea0 = local_10a0._0_8_;
      local_10a0._8_8_ = auVar80._8_8_;
      uStack_e98 = local_10a0._8_8_;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_e80._0_4_ = auVar80._0_4_;
      local_e80._4_4_ = auVar80._4_4_;
      uStack_e78._0_4_ = auVar80._8_4_;
      uStack_e78._4_4_ = auVar80._12_4_;
      uStack_11c4 = 0;
      local_11e0 = (float)local_e80 * (float)local_e80;
      fStack_11dc = local_e80._4_4_ * local_e80._4_4_;
      fStack_11d8 = (float)uStack_e78 * (float)uStack_e78;
      fStack_11d4 = uStack_e78._4_4_ * uStack_e78._4_4_;
      uStack_11d0 = 0;
      uStack_11cc = 0;
      uStack_11c8 = 0;
      local_df8 = &local_11e0;
      local_db8 = _ps256_coscof_p1;
      local_ac0 = 0x37ccf5ce37ccf5ce;
      uStack_ab8 = uStack_1138;
      uStack_1130 = auVar64._16_8_;
      uStack_ab0 = uStack_1130;
      uStack_1128 = auVar81._24_8_;
      uStack_aa8 = uStack_1128;
      local_ae0 = CONCAT44(fStack_11dc,local_11e0);
      uStack_ad8 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_ad0 = 0;
      uStack_ac8 = 0;
      local_b00[0] = -0.0013887316;
      local_b00[1] = -0.0013887316;
      afStack_af8[0] = -0.0013887316;
      afStack_af8[1] = -0.0013887316;
      afStack_af0[0] = -0.0013887316;
      afStack_af0[1] = -0.0013887316;
      afStack_ae8[0] = -0.0013887316;
      afStack_ae8[1] = -0.0013887316;
      auVar6._8_4_ = -0.0013887316;
      auVar6._12_4_ = -0.0013887316;
      auVar6._0_4_ = -0.0013887316;
      auVar6._4_4_ = -0.0013887316;
      auVar6._16_4_ = -0.0013887316;
      auVar6._20_4_ = -0.0013887316;
      auVar6._24_4_ = -0.0013887316;
      auVar6._28_4_ = -0.0013887316;
      auVar80 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11d4,
                                                   CONCAT48(fStack_11d8,
                                                            CONCAT44(fStack_11dc,local_11e0)))),
                                auVar81,auVar6);
      local_dd0 = _ps256_coscof_p2;
      local_1140 = auVar80._0_8_;
      local_a60 = local_1140;
      uStack_1138 = auVar80._8_8_;
      uStack_a58 = uStack_1138;
      uStack_a50 = 0;
      uStack_a48 = 0;
      local_a80 = CONCAT44(fStack_11dc,local_11e0);
      uStack_a78 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_a70 = 0;
      uStack_a68 = 0;
      local_aa0[0] = 0.041666646;
      local_aa0[1] = 0.041666646;
      afStack_a98[0] = 0.041666646;
      afStack_a98[1] = 0.041666646;
      afStack_a90[0] = 0.041666646;
      afStack_a90[1] = 0.041666646;
      afStack_a88[0] = 0.041666646;
      afStack_a88[1] = 0.041666646;
      auVar7._8_4_ = 0.041666646;
      auVar7._12_4_ = 0.041666646;
      auVar7._0_4_ = 0.041666646;
      auVar7._4_4_ = 0.041666646;
      auVar7._16_4_ = 0.041666646;
      auVar7._20_4_ = 0.041666646;
      auVar7._24_4_ = 0.041666646;
      auVar7._28_4_ = 0.041666646;
      auVar80 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11d4,
                                                   CONCAT48(fStack_11d8,
                                                            CONCAT44(fStack_11dc,local_11e0)))),
                                ZEXT1632(auVar80),auVar7);
      local_1140 = auVar80._0_8_;
      uVar16 = local_1140;
      uStack_1138 = auVar80._8_8_;
      uVar17 = uStack_1138;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = CONCAT44(fStack_11dc,local_11e0);
      uStack_ed8 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_ec0._0_4_ = auVar80._0_4_;
      local_ec0._4_4_ = auVar80._4_4_;
      uStack_eb8._0_4_ = auVar80._8_4_;
      uStack_eb8._4_4_ = auVar80._12_4_;
      local_1140._4_4_ = local_ec0._4_4_ * fStack_11dc;
      local_1140._0_4_ = (float)local_ec0 * local_11e0;
      uStack_1138._0_4_ = (float)uStack_eb8 * fStack_11d8;
      uStack_1138._4_4_ = uStack_eb8._4_4_ * fStack_11d4;
      local_f00 = local_1140;
      uStack_ef8 = uStack_1138;
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      local_f20 = CONCAT44(fStack_11dc,local_11e0);
      uStack_f18 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_1140._4_4_ = local_ec0._4_4_ * fStack_11dc * fStack_11dc;
      local_1140._0_4_ = (float)local_ec0 * local_11e0 * local_11e0;
      local_920 = local_1140;
      uStack_1138._0_4_ = (float)uStack_eb8 * fStack_11d8 * fStack_11d8;
      uStack_1138._4_4_ = uStack_eb8._4_4_ * fStack_11d4 * fStack_11d4;
      auVar80 = _local_1140;
      _local_1140 = ZEXT1632(_local_1140);
      auVar81 = _local_1140;
      local_d50 = ::_ps256_0p5;
      local_8e0 = CONCAT44(fStack_11dc,local_11e0);
      uStack_8d8 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900[0] = 0.5;
      local_900[1] = 0.5;
      afStack_8f8[0] = 0.5;
      afStack_8f8[1] = 0.5;
      afStack_8f0[0] = 0.5;
      afStack_8f0[1] = 0.5;
      afStack_8e8[0] = 0.5;
      afStack_8e8[1] = 0.5;
      uStack_1138 = auVar80._8_8_;
      uStack_918 = uStack_1138;
      uStack_910 = 0;
      uStack_908 = 0;
      auVar34._8_4_ = 0.5;
      auVar34._12_4_ = 0.5;
      auVar34._0_4_ = 0.5;
      auVar34._4_4_ = 0.5;
      auVar34._16_4_ = 0.5;
      auVar34._20_4_ = 0.5;
      auVar34._24_4_ = 0.5;
      auVar34._28_4_ = 0.5;
      auVar80 = vfnmadd213ps_fma(auVar34,ZEXT1632(CONCAT412(fStack_11d4,
                                                            CONCAT48(fStack_11d8,
                                                                     CONCAT44(fStack_11dc,local_11e0
                                                                             )))),auVar81);
      local_1140 = auVar80._0_8_;
      uVar18 = local_1140;
      uStack_1138 = auVar80._8_8_;
      uVar19 = uStack_1138;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = 0x3f800000;
      uStack_cfc = 0x3f800000;
      uStack_cf8 = 0x3f800000;
      uStack_cf4 = 0x3f800000;
      uStack_cf0 = 0x3f800000;
      uStack_cec = 0x3f800000;
      uStack_ce8 = 0x3f800000;
      uStack_ce4 = 0x3f800000;
      local_ce0._0_4_ = auVar80._0_4_;
      local_ce0._4_4_ = auVar80._4_4_;
      uStack_cd8._0_4_ = auVar80._8_4_;
      uStack_cd8._4_4_ = auVar80._12_4_;
      local_1140._4_4_ = local_ce0._4_4_ + 1.0;
      local_1140._0_4_ = (float)local_ce0 + 1.0;
      uStack_1138._0_4_ = (float)uStack_cd8 + 1.0;
      uStack_1138._4_4_ = uStack_cd8._4_4_ + 1.0;
      uStack_1130._0_4_ = 0x3f800000;
      uStack_1130._4_4_ = 0x3f800000;
      auVar65 = _local_1140;
      uStack_1128._0_4_ = 0x3f800000;
      uStack_1128._4_4_ = 0x3f800000;
      auVar5 = _local_1140;
      uStack_11f8._0_4_ = 0xb94ca1f9;
      local_1200 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_11f8._4_4_ = 0xb94ca1f9;
      uStack_11f0._0_4_ = 0xb94ca1f9;
      uStack_11f0._4_4_ = 0xb94ca1f9;
      auVar64 = _local_1200;
      uStack_11e8._0_4_ = 0xb94ca1f9;
      uStack_11e8._4_4_ = 0xb94ca1f9;
      auVar81 = _local_1200;
      local_e08 = local_1200;
      local_de8 = _ps256_sincof_p1;
      local_a00 = 0xb94ca1f9b94ca1f9;
      uStack_9f8 = uStack_11f8;
      uStack_11f0 = auVar64._16_8_;
      uStack_9f0 = uStack_11f0;
      uStack_11e8 = auVar81._24_8_;
      uStack_9e8 = uStack_11e8;
      local_a20 = CONCAT44(fStack_11dc,local_11e0);
      uStack_a18 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_a10 = 0;
      uStack_a08 = 0;
      local_a40[0] = 0.008332161;
      local_a40[1] = 0.008332161;
      afStack_a38[0] = 0.008332161;
      afStack_a38[1] = 0.008332161;
      afStack_a30[0] = 0.008332161;
      afStack_a30[1] = 0.008332161;
      afStack_a28[0] = 0.008332161;
      afStack_a28[1] = 0.008332161;
      auVar8._8_4_ = 0.008332161;
      auVar8._12_4_ = 0.008332161;
      auVar8._0_4_ = 0.008332161;
      auVar8._4_4_ = 0.008332161;
      auVar8._16_4_ = 0.008332161;
      auVar8._20_4_ = 0.008332161;
      auVar8._24_4_ = 0.008332161;
      auVar8._28_4_ = 0.008332161;
      auVar80 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11d4,
                                                   CONCAT48(fStack_11d8,
                                                            CONCAT44(fStack_11dc,local_11e0)))),
                                auVar81,auVar8);
      local_e00 = _ps256_sincof_p2;
      local_1200 = auVar80._0_8_;
      local_9a0 = local_1200;
      uStack_11f8 = auVar80._8_8_;
      uStack_998 = uStack_11f8;
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0 = CONCAT44(fStack_11dc,local_11e0);
      uStack_9b8 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      local_9e0[0] = -0.16666655;
      local_9e0[1] = -0.16666655;
      afStack_9d8[0] = -0.16666655;
      afStack_9d8[1] = -0.16666655;
      afStack_9d0[0] = -0.16666655;
      afStack_9d0[1] = -0.16666655;
      afStack_9c8[0] = -0.16666655;
      afStack_9c8[1] = -0.16666655;
      auVar33._8_4_ = -0.16666655;
      auVar33._12_4_ = -0.16666655;
      auVar33._0_4_ = -0.16666655;
      auVar33._4_4_ = -0.16666655;
      auVar33._16_4_ = -0.16666655;
      auVar33._20_4_ = -0.16666655;
      auVar33._24_4_ = -0.16666655;
      auVar33._28_4_ = -0.16666655;
      auVar80 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11d4,
                                                   CONCAT48(fStack_11d8,
                                                            CONCAT44(fStack_11dc,local_11e0)))),
                                ZEXT1632(auVar80),auVar33);
      local_1200 = auVar80._0_8_;
      uVar20 = local_1200;
      uStack_11f8 = auVar80._8_8_;
      uVar21 = uStack_11f8;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_f60 = CONCAT44(fStack_11dc,local_11e0);
      uStack_f58 = CONCAT44(fStack_11d4,fStack_11d8);
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_f40._0_4_ = auVar80._0_4_;
      local_f40._4_4_ = auVar80._4_4_;
      uStack_f38._0_4_ = auVar80._8_4_;
      uStack_f38._4_4_ = auVar80._12_4_;
      local_1200._4_4_ = local_f40._4_4_ * fStack_11dc;
      local_1200._0_4_ = (float)local_f40 * local_11e0;
      local_940 = local_1200;
      uStack_11f8._0_4_ = (float)uStack_f38 * fStack_11d8;
      uStack_11f8._4_4_ = uStack_f38._4_4_ * fStack_11d4;
      auVar80 = _local_1200;
      _local_1200 = ZEXT1632(_local_1200);
      auVar81 = _local_1200;
      uStack_11f8 = auVar80._8_8_;
      uStack_938 = uStack_11f8;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960 = local_10a0._0_8_;
      uStack_958 = local_10a0._8_8_;
      uStack_950 = 0;
      uStack_948 = 0;
      local_980 = local_10a0._0_8_;
      uStack_978 = local_10a0._8_8_;
      uStack_970 = 0;
      uStack_968 = 0;
      auVar80 = vfmadd213ps_fma(auVar89,auVar81,auVar89);
      local_1100._4_4_ = local_1180._4_4_;
      uStack_10f8._4_4_ = local_1180._12_4_;
      uStack_10f0._4_4_ = local_1180._20_4_;
      uStack_10e8._4_4_ = local_1180._28_4_;
      local_1020 = local_1180._0_8_;
      uStack_1018 = local_1180._8_8_;
      uStack_1010 = local_1180._16_8_;
      uStack_1008 = local_1180._24_8_;
      local_1200 = auVar80._0_8_;
      local_1040 = local_1200;
      uStack_11f8 = auVar80._8_8_;
      uStack_1038 = uStack_11f8;
      uStack_1030 = 0;
      uStack_1028 = 0;
      _local_1200 = vpand_avx2(local_1180,ZEXT1632(auVar80));
      local_680 = local_1180._0_8_;
      uStack_678 = local_1180._8_8_;
      uStack_670 = local_1180._16_8_;
      uStack_668 = local_1180._24_8_;
      local_6a0 = local_1140;
      uStack_698 = uStack_1138;
      uStack_1130 = auVar65._16_8_;
      uStack_690 = uStack_1130;
      uStack_1128 = auVar5._24_8_;
      uStack_688 = uStack_1128;
      auVar81 = vpternlogq_avx512vl(local_1180,local_1180,local_1180,0xf);
      auVar41._16_8_ = uStack_1130;
      auVar41._0_16_ = _local_1140;
      auVar41._24_8_ = uStack_1128;
      auVar81 = vpand_avx2(auVar81,auVar41);
      local_1140 = auVar81._0_8_;
      uVar22 = local_1140;
      uStack_1138 = auVar81._8_8_;
      uVar23 = uStack_1138;
      uStack_1130 = auVar81._16_8_;
      uVar24 = uStack_1130;
      uStack_1128 = auVar81._24_8_;
      uVar25 = uStack_1128;
      local_d20._0_4_ = auVar81._0_4_;
      local_d20._4_4_ = auVar81._4_4_;
      uStack_d18._0_4_ = auVar81._8_4_;
      uStack_d18._4_4_ = auVar81._12_4_;
      uStack_d10._0_4_ = auVar81._16_4_;
      uStack_d10._4_4_ = auVar81._20_4_;
      uStack_d08._0_4_ = auVar81._24_4_;
      uStack_d08._4_4_ = auVar81._28_4_;
      local_d40._0_4_ = local_1200._0_4_;
      local_d40._4_4_ = local_1200._4_4_;
      uStack_d38._0_4_ = local_1200._8_4_;
      uStack_d38._4_4_ = local_1200._12_4_;
      uStack_d30._0_4_ = local_1200._16_4_;
      uStack_d30._4_4_ = local_1200._20_4_;
      uStack_d28._0_4_ = local_1200._24_4_;
      uStack_d28._4_4_ = local_1200._28_4_;
      local_1140._4_4_ = local_d20._4_4_ + local_d40._4_4_;
      local_1140._0_4_ = (float)local_d20 + (float)local_d40;
      uStack_1138._0_4_ = (float)uStack_d18 + (float)uStack_d38;
      uStack_1138._4_4_ = uStack_d18._4_4_ + uStack_d38._4_4_;
      uStack_1130._0_4_ = (float)uStack_d10 + (float)uStack_d30;
      uStack_1130._4_4_ = uStack_d10._4_4_ + uStack_d30._4_4_;
      auVar64 = _local_1140;
      uStack_1128._0_4_ = (float)uStack_d08 + (float)uStack_d28;
      uStack_1128._4_4_ = uStack_d08._4_4_ + uStack_d28._4_4_;
      auVar81 = _local_1140;
      local_700 = local_1140;
      uStack_6f8 = uStack_1138;
      uStack_1130 = auVar64._16_8_;
      uStack_6f0 = uStack_1130;
      uStack_1128 = auVar81._24_8_;
      uStack_6e8 = uStack_1128;
      auVar40._16_8_ = uStack_1130;
      auVar40._0_16_ = _local_1140;
      auVar40._24_8_ = uStack_1128;
      auVar39._16_8_ = uStack_710;
      auVar39._0_16_ = local_1120;
      auVar39._24_8_ = uStack_708;
      _local_1140 = auVar40 ^ auVar39;
      local_29e0 = local_1140;
      uStack_29d8 = uStack_1138;
      uStack_29d0 = uStack_1130;
      uStack_29c8 = uStack_1128;
      local_2820 = local_2930;
      local_2840 = local_1140;
      uStack_2838 = uStack_1138;
      uStack_2830 = uStack_1130;
      uStack_2828 = uStack_1128;
      *(undefined1 (*) [32])*local_2930 = _local_1140;
      local_2930 = (undefined1 (*) [64])(*local_2930 + 0x20);
      uVar66 = local_1180._0_8_;
      uVar67 = local_1180._8_8_;
      uVar10 = local_1180._16_8_;
      uVar11 = local_1180._24_8_;
      local_10a0 = auVar89;
      uStack_f90 = uStack_fd0;
      uStack_f88 = uStack_fc8;
      local_f40 = uVar20;
      uStack_f38 = uVar21;
      local_ec0 = uVar16;
      uStack_eb8 = uVar17;
      local_e80 = local_ea0;
      uStack_e78 = uStack_e98;
      uStack_e70 = uStack_e90;
      uStack_e68 = uStack_e88;
      local_e40 = uVar12;
      uStack_e38 = uVar13;
      uStack_e30 = uVar14;
      uStack_e28 = uVar15;
      local_e10 = local_e18;
      local_df0 = local_e08;
      local_de0 = local_df8;
      local_dd8 = local_e08;
      local_dc8 = local_df8;
      local_db0 = local_df8;
      local_da8 = local_dc0;
      local_da0 = local_e18;
      local_d90 = local_dc0;
      local_d88 = local_e18;
      local_d78 = local_dc0;
      local_d70 = local_e18;
      local_d60 = local_dc0;
      local_d58 = local_dc0;
      local_d48 = local_df8;
      local_d40 = local_1200;
      uStack_d38 = uStack_11f8;
      uStack_d30 = uStack_11f0;
      uStack_d28 = uStack_11e8;
      local_d20 = uVar22;
      uStack_d18 = uVar23;
      uStack_d10 = uVar24;
      uStack_d08 = uVar25;
      local_ce0 = uVar18;
      uStack_cd8 = uVar19;
    }
    for (; uStack_5d8 = uVar67, local_5e0 = uVar66, uVar77 = uStack_5d8._4_4_,
        uVar76 = local_5e0._4_4_, local_27a8 = local_28d0, local_2958 = local_27f8,
        uVar72 = local_10e0._4_4_, uVar73 = uStack_10d8._4_4_, uVar74 = uStack_10d0._4_4_,
        uVar75 = uStack_10c8._4_4_, uVar78 = local_5d0._4_4_, uVar79 = uStack_5c8._4_4_,
        local_297c + 3 < local_2924; local_297c = local_297c + 4) {
      local_2818 = local_2930;
      local_550 = *(undefined8 *)*local_2930;
      uStack_548 = *(undefined8 *)(*local_2930 + 8);
      local_2758 = local_2909;
      local_2760 = &local_29f0;
      local_520 = (undefined1  [16])0x0;
      local_540 = 0x7fffffff;
      uStack_53c = 0x7fffffff;
      uStack_538 = 0x7fffffff;
      uStack_534 = 0x7fffffff;
      auVar1._8_4_ = 0x7fffffff;
      auVar1._0_8_ = 0x7fffffff7fffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar1 = vpand_avx(*(undefined1 (*) [16])*local_2930,auVar1);
      local_560 = 0x80000000;
      uStack_55c = 0x80000000;
      uStack_558 = 0x80000000;
      uStack_554 = 0x80000000;
      auVar80._8_4_ = 0x80000000;
      auVar80._0_8_ = 0x8000000080000000;
      auVar80._12_4_ = 0x80000000;
      auVar2 = vpand_avx(*(undefined1 (*) [16])*local_2930,auVar80);
      local_5b0._0_8_ = auVar1._0_8_;
      uVar10 = local_5b0._0_8_;
      local_5b0._8_8_ = auVar1._8_8_;
      uVar11 = local_5b0._8_8_;
      local_490 = 0x3fa2f983;
      uStack_48c = 0x3fa2f983;
      uStack_488 = 0x3fa2f983;
      uStack_484 = 0x3fa2f983;
      local_480._0_4_ = auVar1._0_4_;
      local_480._4_4_ = auVar1._4_4_;
      uStack_478._0_4_ = auVar1._8_4_;
      uStack_478._4_4_ = auVar1._12_4_;
      local_600._4_4_ = local_480._4_4_ * 1.2732395;
      local_600._0_4_ = (float)local_480 * 1.2732395;
      uStack_5f8._0_4_ = (float)uStack_478 * 1.2732395;
      uStack_5f8._4_4_ = uStack_478._4_4_ * 1.2732395;
      local_430 = local_600;
      uStack_428 = uStack_5f8;
      local_620._4_4_ = (int)(local_480._4_4_ * 1.2732395);
      local_620._0_4_ = (int)((float)local_480 * 1.2732395);
      local_620._8_4_ = (int)((float)uStack_478 * 1.2732395);
      local_620._12_4_ = (int)(uStack_478._4_4_ * 1.2732395);
      local_320 = local_620._0_8_;
      uStack_318 = local_620._8_8_;
      local_330 = 0x100000001;
      uStack_328 = 0x100000001;
      auVar4._8_8_ = local_620._8_8_;
      auVar4._0_8_ = local_620._0_8_;
      auVar3._8_8_ = 0x100000001;
      auVar3._0_8_ = 0x100000001;
      auVar80 = vpaddd_avx(auVar4,auVar3);
      local_620._0_8_ = auVar80._0_8_;
      local_f0 = local_620._0_8_;
      local_620._8_8_ = auVar80._8_8_;
      uStack_e8 = local_620._8_8_;
      local_100 = 0xfffffffefffffffe;
      uStack_f8 = 0xfffffffefffffffe;
      auVar48._8_8_ = 0xfffffffefffffffe;
      auVar48._0_8_ = 0xfffffffefffffffe;
      auVar3 = vpand_avx(auVar80,auVar48);
      local_620._0_8_ = auVar3._0_8_;
      local_420 = local_620._0_8_;
      local_620._8_8_ = auVar3._8_8_;
      uStack_418 = local_620._8_8_;
      auVar80 = vcvtdq2ps_avx(auVar3);
      local_110 = local_620._0_8_;
      uStack_108 = local_620._8_8_;
      local_120 = 0x400000004;
      uStack_118 = 0x400000004;
      auVar47._8_8_ = 0x400000004;
      auVar47._0_8_ = 0x400000004;
      auVar4 = vpand_avx(auVar3,auVar47);
      local_610._0_8_ = auVar4._0_8_;
      local_300 = local_610._0_8_;
      local_610._8_8_ = auVar4._8_8_;
      uStack_2f8 = local_610._8_8_;
      local_304 = 0x1d;
      local_610 = vpslld_avx(auVar4,ZEXT416(0x1d));
      local_130 = local_620._0_8_;
      uStack_128 = local_620._8_8_;
      local_140 = 0x200000002;
      uStack_138 = 0x200000002;
      auVar46._8_8_ = 0x200000002;
      auVar46._0_8_ = 0x200000002;
      auVar3 = vpand_avx(auVar3,auVar46);
      local_620._0_8_ = auVar3._0_8_;
      local_d0 = local_620._0_8_;
      local_620._8_8_ = auVar3._8_8_;
      uStack_c8 = local_620._8_8_;
      local_c0 = (undefined1  [16])0x0;
      local_e0 = 0;
      uStack_d8 = 0;
      local_620 = vpcmpeqd_avx(auVar3,ZEXT816(0));
      local_590 = local_610._0_8_;
      uStack_588 = local_610._8_8_;
      local_630 = local_610._0_8_;
      uStack_628 = local_610._8_8_;
      local_5a0 = local_620._0_8_;
      uStack_598 = local_620._8_8_;
      local_640 = local_620._0_8_;
      uStack_638 = local_620._8_8_;
      local_5f0 = auVar2._0_8_;
      local_80 = local_5f0;
      uStack_5e8 = auVar2._8_8_;
      uStack_78 = uStack_5e8;
      local_90 = local_610._0_8_;
      uStack_88 = local_610._8_8_;
      local_b0 = local_5f0 ^ local_610._0_8_;
      uStack_a8 = uStack_5e8 ^ local_610._8_8_;
      uStack_5e8 = uStack_a8;
      local_5f0 = local_b0;
      local_5c0 = 0xbf490000;
      uStack_5bc = 0xbf490000;
      uStack_5b8 = 0xbf490000;
      uStack_5b4 = 0xbf490000;
      local_5d0 = 0xb97da000b97da000;
      local_5d0._4_4_ = 0xb97da000;
      uStack_5c8 = 0xb97da000b97da000;
      uStack_5c8._4_4_ = 0xb97da000;
      local_408 = local_600;
      local_340 = &local_5c0;
      local_3f0 = local_5b0;
      local_600 = auVar80._0_8_;
      local_2a0 = local_600;
      uStack_5f8 = auVar80._8_8_;
      uStack_298 = uStack_5f8;
      local_2b0 = 0xbf490000bf490000;
      uStack_2a8 = 0xbf490000bf490000;
      auVar62._8_4_ = 0xbf490000;
      auVar62._0_8_ = 0xbf490000bf490000;
      auVar62._12_4_ = 0xbf490000;
      local_2c0 = local_5b0._0_8_;
      uStack_2b8 = local_5b0._8_8_;
      auVar1 = vfmadd213ps_fma(auVar62,auVar80,auVar1);
      local_358 = &local_5d0;
      local_270 = local_600;
      uStack_268 = uStack_5f8;
      local_280 = 0xb97da000b97da000;
      uStack_278 = 0xb97da000b97da000;
      auVar61._8_4_ = 0xb97da000;
      auVar61._0_8_ = 0xb97da000b97da000;
      auVar61._12_4_ = 0xb97da000;
      local_5b0._0_8_ = auVar1._0_8_;
      local_290 = local_5b0._0_8_;
      local_5b0._8_8_ = auVar1._8_8_;
      uStack_288 = local_5b0._8_8_;
      auVar1 = vfmadd213ps_fma(auVar61,auVar80,auVar1);
      local_370 = &local_5e0;
      local_240 = local_600;
      uStack_238 = uStack_5f8;
      local_250 = 0xb3222169b3222169;
      uStack_248 = 0xb3222169b3222169;
      auVar60._8_4_ = 0xb3222169;
      auVar60._0_8_ = 0xb3222169b3222169;
      auVar60._12_4_ = 0xb3222169;
      local_5b0._0_8_ = auVar1._0_8_;
      local_260 = local_5b0._0_8_;
      local_5b0._8_8_ = auVar1._8_8_;
      uStack_258 = local_5b0._8_8_;
      local_5b0 = vfmadd213ps_fma(auVar60,auVar80,auVar1);
      uStack_5f8._0_4_ = 0x37ccf5ce;
      local_600 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_5f8._4_4_ = 0x37ccf5ce;
      local_4b0 = local_5b0._0_8_;
      uStack_4a8 = local_5b0._8_8_;
      local_4a0._0_4_ = local_5b0._0_4_;
      local_4a0._4_4_ = local_5b0._4_4_;
      uStack_498._0_4_ = local_5b0._8_4_;
      uStack_498._4_4_ = local_5b0._12_4_;
      local_650 = (float)local_4a0 * (float)local_4a0;
      fStack_64c = local_4a0._4_4_ * local_4a0._4_4_;
      fStack_648 = (float)uStack_498 * (float)uStack_498;
      fStack_644 = uStack_498._4_4_ * uStack_498._4_4_;
      local_3f8 = &local_650;
      local_390 = _ps_coscof_p1;
      local_210 = 0x37ccf5ce37ccf5ce;
      uStack_208 = uStack_5f8;
      local_220 = CONCAT44(fStack_64c,local_650);
      uStack_218 = CONCAT44(fStack_644,fStack_648);
      auVar55._4_4_ = fStack_64c;
      auVar55._0_4_ = local_650;
      auVar55._8_4_ = fStack_648;
      auVar55._12_4_ = fStack_644;
      local_230[0] = -0.0013887316;
      local_230[1] = -0.0013887316;
      afStack_228[0] = -0.0013887316;
      afStack_228[1] = -0.0013887316;
      auVar42._8_4_ = -0.0013887316;
      auVar42._12_4_ = -0.0013887316;
      auVar42._0_4_ = -0.0013887316;
      auVar42._4_4_ = -0.0013887316;
      auVar80 = vfmadd213ps_fma(auVar55,_local_600,auVar42);
      local_3a8 = _ps_coscof_p2;
      local_600 = auVar80._0_8_;
      local_1e0 = local_600;
      uStack_5f8 = auVar80._8_8_;
      uStack_1d8 = uStack_5f8;
      local_1f0 = CONCAT44(fStack_64c,local_650);
      uStack_1e8 = CONCAT44(fStack_644,fStack_648);
      auVar56._4_4_ = fStack_64c;
      auVar56._0_4_ = local_650;
      auVar56._8_4_ = fStack_648;
      auVar56._12_4_ = fStack_644;
      local_200[0] = 0.041666646;
      local_200[1] = 0.041666646;
      afStack_1f8[0] = 0.041666646;
      afStack_1f8[1] = 0.041666646;
      auVar43._8_4_ = 0.041666646;
      auVar43._12_4_ = 0.041666646;
      auVar43._0_4_ = 0.041666646;
      auVar43._4_4_ = 0.041666646;
      auVar80 = vfmadd213ps_fma(auVar56,auVar80,auVar43);
      local_600 = auVar80._0_8_;
      uVar12 = local_600;
      uStack_5f8 = auVar80._8_8_;
      uVar13 = uStack_5f8;
      local_4d0 = CONCAT44(fStack_64c,local_650);
      uStack_4c8 = CONCAT44(fStack_644,fStack_648);
      local_4c0._0_4_ = auVar80._0_4_;
      local_4c0._4_4_ = auVar80._4_4_;
      uStack_4b8._0_4_ = auVar80._8_4_;
      uStack_4b8._4_4_ = auVar80._12_4_;
      local_600._4_4_ = local_4c0._4_4_ * fStack_64c;
      local_600._0_4_ = (float)local_4c0 * local_650;
      uStack_5f8._0_4_ = (float)uStack_4b8 * fStack_648;
      uStack_5f8._4_4_ = uStack_4b8._4_4_ * fStack_644;
      local_4e0 = local_600;
      uStack_4d8 = uStack_5f8;
      local_4f0 = CONCAT44(fStack_64c,local_650);
      uStack_4e8 = CONCAT44(fStack_644,fStack_648);
      local_600._4_4_ = local_4c0._4_4_ * fStack_64c * fStack_64c;
      local_600._0_4_ = (float)local_4c0 * local_650 * local_650;
      uStack_5f8._0_4_ = (float)uStack_4b8 * fStack_648 * fStack_648;
      uStack_5f8._4_4_ = uStack_4b8._4_4_ * fStack_644 * fStack_644;
      local_400 = ::_ps_0p5;
      local_2d0 = CONCAT44(fStack_64c,local_650);
      uStack_2c8 = CONCAT44(fStack_644,fStack_648);
      auVar57._4_4_ = fStack_64c;
      auVar57._0_4_ = local_650;
      auVar57._8_4_ = fStack_648;
      auVar57._12_4_ = fStack_644;
      local_2e0[0] = 0.5;
      local_2e0[1] = 0.5;
      afStack_2d8[0] = 0.5;
      afStack_2d8[1] = 0.5;
      local_2f0 = local_600;
      uStack_2e8 = uStack_5f8;
      auVar2._8_4_ = 0.5;
      auVar2._12_4_ = 0.5;
      auVar2._0_4_ = 0.5;
      auVar2._4_4_ = 0.5;
      auVar80 = vfnmadd213ps_fma(auVar2,auVar57,_local_600);
      local_600 = auVar80._0_8_;
      uVar14 = local_600;
      uStack_5f8 = auVar80._8_8_;
      uVar15 = uStack_5f8;
      local_450 = 0x3f800000;
      uStack_44c = 0x3f800000;
      uStack_448 = 0x3f800000;
      uStack_444 = 0x3f800000;
      local_440._0_4_ = auVar80._0_4_;
      local_440._4_4_ = auVar80._4_4_;
      uStack_438._0_4_ = auVar80._8_4_;
      uStack_438._4_4_ = auVar80._12_4_;
      local_600._4_4_ = local_440._4_4_ + 1.0;
      local_600._0_4_ = (float)local_440 + 1.0;
      uStack_5f8._0_4_ = (float)uStack_438 + 1.0;
      uStack_5f8._4_4_ = uStack_438._4_4_ + 1.0;
      uStack_658._0_4_ = 0xb94ca1f9;
      local_660 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_658._4_4_ = 0xb94ca1f9;
      local_3e0 = local_660;
      local_3c0 = _ps_sincof_p1;
      local_1b0 = 0xb94ca1f9b94ca1f9;
      uStack_1a8 = uStack_658;
      local_1c0 = CONCAT44(fStack_64c,local_650);
      uStack_1b8 = CONCAT44(fStack_644,fStack_648);
      auVar58._4_4_ = fStack_64c;
      auVar58._0_4_ = local_650;
      auVar58._8_4_ = fStack_648;
      auVar58._12_4_ = fStack_644;
      local_1d0[0] = 0.008332161;
      local_1d0[1] = 0.008332161;
      afStack_1c8[0] = 0.008332161;
      afStack_1c8[1] = 0.008332161;
      auVar44._8_4_ = 0.008332161;
      auVar44._12_4_ = 0.008332161;
      auVar44._0_4_ = 0.008332161;
      auVar44._4_4_ = 0.008332161;
      auVar80 = vfmadd213ps_fma(auVar58,_local_660,auVar44);
      local_3d8 = _ps_sincof_p2;
      local_660 = auVar80._0_8_;
      local_180 = local_660;
      uStack_658 = auVar80._8_8_;
      uStack_178 = uStack_658;
      local_190 = CONCAT44(fStack_64c,local_650);
      uStack_188 = CONCAT44(fStack_644,fStack_648);
      auVar59._4_4_ = fStack_64c;
      auVar59._0_4_ = local_650;
      auVar59._8_4_ = fStack_648;
      auVar59._12_4_ = fStack_644;
      local_1a0[0] = -0.16666655;
      local_1a0[1] = -0.16666655;
      afStack_198[0] = -0.16666655;
      afStack_198[1] = -0.16666655;
      auVar45._8_4_ = -0.16666655;
      auVar45._12_4_ = -0.16666655;
      auVar45._0_4_ = -0.16666655;
      auVar45._4_4_ = -0.16666655;
      auVar80 = vfmadd213ps_fma(auVar59,auVar80,auVar45);
      local_660 = auVar80._0_8_;
      uVar16 = local_660;
      uStack_658 = auVar80._8_8_;
      uVar17 = uStack_658;
      local_510 = CONCAT44(fStack_64c,local_650);
      uStack_508 = CONCAT44(fStack_644,fStack_648);
      local_500._0_4_ = auVar80._0_4_;
      local_500._4_4_ = auVar80._4_4_;
      uStack_4f8._0_4_ = auVar80._8_4_;
      uStack_4f8._4_4_ = auVar80._12_4_;
      local_660._4_4_ = local_500._4_4_ * fStack_64c;
      local_660._0_4_ = (float)local_500 * local_650;
      uStack_658._0_4_ = (float)uStack_4f8 * fStack_648;
      uStack_658._4_4_ = uStack_4f8._4_4_ * fStack_644;
      local_150 = local_660;
      uStack_148 = uStack_658;
      local_160 = local_5b0._0_8_;
      uStack_158 = local_5b0._8_8_;
      local_170 = local_5b0._0_8_;
      uStack_168 = local_5b0._8_8_;
      auVar80 = vfmadd213ps_fma(local_5b0,_local_660,local_5b0);
      local_5e0._4_4_ = local_620._4_4_;
      uStack_5d8._4_4_ = local_620._12_4_;
      local_570 = local_620._0_8_;
      uStack_568 = local_620._8_8_;
      local_660 = auVar80._0_8_;
      local_580 = local_660;
      uStack_658 = auVar80._8_8_;
      uStack_578 = uStack_658;
      _local_660 = vpand_avx(local_620,auVar80);
      local_60 = local_620._0_8_;
      uStack_58 = local_620._8_8_;
      local_70 = local_600;
      uStack_68 = uStack_5f8;
      auVar80 = vpternlogq_avx512vl(local_620,local_620,local_620,0xf);
      auVar51._8_8_ = uStack_5f8;
      auVar51._0_8_ = local_600;
      auVar80 = vpand_avx(auVar80,auVar51);
      local_600 = auVar80._0_8_;
      uVar18 = local_600;
      uStack_5f8 = auVar80._8_8_;
      uVar19 = uStack_5f8;
      local_460._0_4_ = auVar80._0_4_;
      local_460._4_4_ = auVar80._4_4_;
      uStack_458._0_4_ = auVar80._8_4_;
      uStack_458._4_4_ = auVar80._12_4_;
      local_470._0_4_ = local_660._0_4_;
      local_470._4_4_ = local_660._4_4_;
      uStack_468._0_4_ = local_660._8_4_;
      uStack_468._4_4_ = local_660._12_4_;
      local_600._4_4_ = local_460._4_4_ + local_470._4_4_;
      local_600._0_4_ = (float)local_460 + (float)local_470;
      uStack_5f8._0_4_ = (float)uStack_458 + (float)uStack_468;
      uStack_5f8._4_4_ = uStack_458._4_4_ + uStack_468._4_4_;
      local_a0 = local_600;
      uStack_98 = uStack_5f8;
      auVar50._8_8_ = uStack_5f8;
      auVar50._0_8_ = local_600;
      auVar49._8_8_ = uStack_a8;
      auVar49._0_8_ = local_b0;
      _local_600 = auVar50 ^ auVar49;
      local_29f0 = local_600;
      uStack_29e8 = uStack_5f8;
      local_2800 = local_2930;
      local_2810 = local_600;
      uStack_2808 = uStack_5f8;
      *(undefined1 (*) [16])*local_2930 = _local_600;
      local_2930 = (undefined1 (*) [64])(*local_2930 + 0x10);
      uVar66 = local_620._0_8_;
      uVar67 = local_620._8_8_;
      local_530 = local_550;
      uStack_528 = uStack_548;
      local_500 = uVar16;
      uStack_4f8 = uVar17;
      local_4c0 = uVar12;
      uStack_4b8 = uVar13;
      local_4a0 = local_4b0;
      uStack_498 = uStack_4a8;
      local_480 = uVar10;
      uStack_478 = uVar11;
      local_470 = local_660;
      uStack_468 = uStack_658;
      local_460 = uVar18;
      uStack_458 = uVar19;
      local_440 = uVar14;
      uStack_438 = uVar15;
      local_3e8 = local_3f0;
      local_3d0 = local_3f8;
      local_3c8 = local_3e0;
      local_3b8 = local_3f8;
      local_3b0 = local_3e0;
      local_3a0 = local_3f8;
      local_398 = local_408;
      local_388 = local_3f8;
      local_380 = local_408;
      local_378 = local_3f0;
      local_368 = local_408;
      local_360 = local_3f0;
      local_350 = local_408;
      local_348 = local_3f0;
      local_338 = local_408;
    }
    for (; uStack_5c8._4_4_ = uVar79, local_5d0._4_4_ = uVar78, uStack_5d8._4_4_ = uVar77,
        local_5e0._4_4_ = uVar76, uStack_10c8._4_4_ = uVar75, uStack_10d0._4_4_ = uVar74,
        uStack_10d8._4_4_ = uVar73, local_10e0._4_4_ = uVar72, uStack_10e8._4_4_ = uVar71,
        uStack_10f0._4_4_ = uVar70, uStack_10f8._4_4_ = uVar69, local_1100._4_4_ = uVar68,
        uVar79 = uStack_5c8._4_4_, uVar78 = local_5d0._4_4_, uVar77 = uStack_5d8._4_4_,
        uVar76 = local_5e0._4_4_, uVar75 = uStack_10c8._4_4_, uVar74 = uStack_10d0._4_4_,
        uVar73 = uStack_10d8._4_4_, uVar72 = local_10e0._4_4_, uVar71 = uStack_10e8._4_4_,
        uVar70 = uStack_10f0._4_4_, uVar69 = uStack_10f8._4_4_, uVar68 = local_1100._4_4_,
        local_297c < local_2924; local_297c = local_297c + 1) {
      local_2748 = local_2909;
      local_2750 = local_2930;
      uVar66 = local_1100;
      local_1100._4_4_ = uVar68;
      uVar67 = uStack_10f8;
      uStack_10f8._4_4_ = uVar69;
      uVar10 = uStack_10f0;
      uStack_10f0._4_4_ = uVar70;
      uVar11 = uStack_10e8;
      uStack_10e8._4_4_ = uVar71;
      uVar12 = local_10e0;
      local_10e0._4_4_ = uVar72;
      uVar13 = uStack_10d8;
      uStack_10d8._4_4_ = uVar73;
      uVar14 = uStack_10d0;
      uStack_10d0._4_4_ = uVar74;
      uVar15 = uStack_10c8;
      uStack_10c8._4_4_ = uVar75;
      uVar16 = local_5e0;
      local_5e0._4_4_ = uVar76;
      uVar17 = uStack_5d8;
      uStack_5d8._4_4_ = uVar77;
      uVar18 = local_5d0;
      local_5d0._4_4_ = uVar78;
      uVar19 = uStack_5c8;
      uStack_5c8._4_4_ = uVar79;
      fVar88 = sinf(*(float *)*local_2930);
      uVar79 = uStack_5c8._4_4_;
      uVar78 = local_5d0._4_4_;
      uVar77 = uStack_5d8._4_4_;
      uVar76 = local_5e0._4_4_;
      uVar75 = uStack_10c8._4_4_;
      uVar74 = uStack_10d0._4_4_;
      uVar73 = uStack_10d8._4_4_;
      uVar72 = local_10e0._4_4_;
      uVar71 = uStack_10e8._4_4_;
      uVar70 = uStack_10f0._4_4_;
      uVar69 = uStack_10f8._4_4_;
      uVar68 = local_1100._4_4_;
      *(float *)*local_2930 = fVar88;
      local_2930 = (undefined1 (*) [64])(*local_2930 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}